

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

void embree::avx512::CurveNvIntersectorK<4,8>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx512::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  int iVar7;
  undefined4 uVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  code *pcVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 uVar21;
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  long lVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  byte bVar75;
  byte bVar76;
  ulong uVar77;
  uint uVar78;
  uint uVar79;
  ulong uVar80;
  ulong uVar81;
  long lVar82;
  uint uVar83;
  ulong uVar84;
  byte bVar85;
  float fVar86;
  float fVar140;
  float fVar142;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  float fVar87;
  undefined1 auVar97 [16];
  float fVar141;
  float fVar143;
  float fVar145;
  float fVar146;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  float fVar144;
  float fVar147;
  float fVar148;
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined4 uVar149;
  undefined8 uVar150;
  vint4 bi_2;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  vint4 bi_1;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  vint4 bi;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  float fVar176;
  float fVar184;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [64];
  float fVar185;
  float fVar200;
  float fVar201;
  vint4 ai_2;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar202;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  vint4 ai;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  vint4 ai_1;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [16];
  uint uVar217;
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [64];
  undefined1 auVar228 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar229 [64];
  undefined1 auVar230 [16];
  undefined1 auVar231 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  RTCFilterFunctionNArguments local_720;
  long local_6f0;
  undefined1 (*local_6e8) [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_690 [8];
  undefined8 uStack_688;
  undefined1 local_680 [16];
  undefined1 local_670 [16];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  float local_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined4 local_590;
  undefined4 uStack_58c;
  undefined8 uStack_588;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  uint local_560;
  uint uStack_55c;
  uint uStack_558;
  uint uStack_554;
  uint uStack_550;
  uint uStack_54c;
  uint uStack_548;
  uint uStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined4 local_460;
  int local_45c;
  undefined1 local_450 [16];
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  byte local_410;
  float local_400 [4];
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [32];
  int local_2c0;
  int iStack_2bc;
  int iStack_2b8;
  int iStack_2b4;
  int iStack_2b0;
  int iStack_2ac;
  int iStack_2a8;
  int iStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined4 local_240;
  undefined4 uStack_23c;
  undefined4 uStack_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  undefined4 uStack_228;
  undefined4 uStack_224;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined1 local_200 [32];
  uint local_1e0;
  uint uStack_1dc;
  uint uStack_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint local_1c0;
  uint uStack_1bc;
  uint uStack_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined4 uStack_104;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar213 [64];
  
  PVar6 = prim[1];
  uVar81 = (ulong)(byte)PVar6;
  lVar60 = uVar81 * 0x19;
  fVar185 = *(float *)(prim + lVar60 + 0x12);
  auVar92 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar92 = vinsertps_avx(auVar92,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar90 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar90 = vinsertps_avx(auVar90,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar92 = vsubps_avx(auVar92,*(undefined1 (*) [16])(prim + lVar60 + 6));
  auVar177._0_4_ = fVar185 * auVar92._0_4_;
  auVar177._4_4_ = fVar185 * auVar92._4_4_;
  auVar177._8_4_ = fVar185 * auVar92._8_4_;
  auVar177._12_4_ = fVar185 * auVar92._12_4_;
  auVar151._0_4_ = fVar185 * auVar90._0_4_;
  auVar151._4_4_ = fVar185 * auVar90._4_4_;
  auVar151._8_4_ = fVar185 * auVar90._8_4_;
  auVar151._12_4_ = fVar185 * auVar90._12_4_;
  auVar92 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 4 + 6)));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar90 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 5 + 6)));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar95 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 6 + 6)));
  auVar93 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0xb + 6)));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar98 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6)));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar230 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar6 * 0xc + uVar81 + 6)));
  auVar230 = vcvtdq2ps_avx(auVar230);
  uVar84 = (ulong)(uint)((int)(uVar81 * 9) * 2);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 + uVar81 + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  uVar77 = (ulong)(uint)((int)(uVar81 * 5) << 2);
  auVar94 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 + 6)));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar222._4_4_ = auVar151._0_4_;
  auVar222._0_4_ = auVar151._0_4_;
  auVar222._8_4_ = auVar151._0_4_;
  auVar222._12_4_ = auVar151._0_4_;
  auVar96 = vshufps_avx(auVar151,auVar151,0x55);
  auVar91 = vshufps_avx(auVar151,auVar151,0xaa);
  fVar185 = auVar91._0_4_;
  auVar168._0_4_ = fVar185 * auVar95._0_4_;
  fVar200 = auVar91._4_4_;
  auVar168._4_4_ = fVar200 * auVar95._4_4_;
  fVar201 = auVar91._8_4_;
  auVar168._8_4_ = fVar201 * auVar95._8_4_;
  fVar202 = auVar91._12_4_;
  auVar168._12_4_ = fVar202 * auVar95._12_4_;
  auVar164._0_4_ = auVar230._0_4_ * fVar185;
  auVar164._4_4_ = auVar230._4_4_ * fVar200;
  auVar164._8_4_ = auVar230._8_4_ * fVar201;
  auVar164._12_4_ = auVar230._12_4_ * fVar202;
  auVar97._0_4_ = auVar94._0_4_ * fVar185;
  auVar97._4_4_ = auVar94._4_4_ * fVar200;
  auVar97._8_4_ = auVar94._8_4_ * fVar201;
  auVar97._12_4_ = auVar94._12_4_ * fVar202;
  auVar91 = vfmadd231ps_fma(auVar168,auVar96,auVar90);
  auVar89 = vfmadd231ps_fma(auVar164,auVar96,auVar98);
  auVar96 = vfmadd231ps_fma(auVar97,auVar20,auVar96);
  auVar88 = vfmadd231ps_fma(auVar91,auVar222,auVar92);
  auVar89 = vfmadd231ps_fma(auVar89,auVar222,auVar93);
  auVar151 = vfmadd231ps_fma(auVar96,auVar19,auVar222);
  auVar223._4_4_ = auVar177._0_4_;
  auVar223._0_4_ = auVar177._0_4_;
  auVar223._8_4_ = auVar177._0_4_;
  auVar223._12_4_ = auVar177._0_4_;
  auVar96 = vshufps_avx(auVar177,auVar177,0x55);
  auVar91 = vshufps_avx(auVar177,auVar177,0xaa);
  fVar185 = auVar91._0_4_;
  auVar224._0_4_ = fVar185 * auVar95._0_4_;
  fVar200 = auVar91._4_4_;
  auVar224._4_4_ = fVar200 * auVar95._4_4_;
  fVar201 = auVar91._8_4_;
  auVar224._8_4_ = fVar201 * auVar95._8_4_;
  fVar202 = auVar91._12_4_;
  auVar224._12_4_ = fVar202 * auVar95._12_4_;
  auVar186._0_4_ = auVar230._0_4_ * fVar185;
  auVar186._4_4_ = auVar230._4_4_ * fVar200;
  auVar186._8_4_ = auVar230._8_4_ * fVar201;
  auVar186._12_4_ = auVar230._12_4_ * fVar202;
  auVar178._0_4_ = auVar94._0_4_ * fVar185;
  auVar178._4_4_ = auVar94._4_4_ * fVar200;
  auVar178._8_4_ = auVar94._8_4_ * fVar201;
  auVar178._12_4_ = auVar94._12_4_ * fVar202;
  auVar90 = vfmadd231ps_fma(auVar224,auVar96,auVar90);
  auVar95 = vfmadd231ps_fma(auVar186,auVar96,auVar98);
  auVar98 = vfmadd231ps_fma(auVar178,auVar96,auVar20);
  auVar230 = vfmadd231ps_fma(auVar90,auVar223,auVar92);
  auVar20 = vfmadd231ps_fma(auVar95,auVar223,auVar93);
  auVar214._8_4_ = 0x7fffffff;
  auVar214._0_8_ = 0x7fffffff7fffffff;
  auVar214._12_4_ = 0x7fffffff;
  auVar94 = vfmadd231ps_fma(auVar98,auVar223,auVar19);
  auVar92 = vandps_avx(auVar88,auVar214);
  auVar210._8_4_ = 0x219392ef;
  auVar210._0_8_ = 0x219392ef219392ef;
  auVar210._12_4_ = 0x219392ef;
  uVar84 = vcmpps_avx512vl(auVar92,auVar210,1);
  bVar12 = (bool)((byte)uVar84 & 1);
  auVar91._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar88._0_4_;
  bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
  auVar91._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar88._4_4_;
  bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
  auVar91._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar88._8_4_;
  bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
  auVar91._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar88._12_4_;
  auVar92 = vandps_avx(auVar89,auVar214);
  uVar84 = vcmpps_avx512vl(auVar92,auVar210,1);
  bVar12 = (bool)((byte)uVar84 & 1);
  auVar88._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar89._0_4_;
  bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
  auVar88._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar89._4_4_;
  bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
  auVar88._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar89._8_4_;
  bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
  auVar88._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar89._12_4_;
  auVar92 = vandps_avx(auVar151,auVar214);
  uVar84 = vcmpps_avx512vl(auVar92,auVar210,1);
  bVar12 = (bool)((byte)uVar84 & 1);
  auVar89._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar151._0_4_;
  bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
  auVar89._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar151._4_4_;
  bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
  auVar89._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar151._8_4_;
  bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
  auVar89._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar151._12_4_;
  auVar90 = vrcp14ps_avx512vl(auVar91);
  auVar211._8_4_ = 0x3f800000;
  auVar211._0_8_ = &DAT_3f8000003f800000;
  auVar211._12_4_ = 0x3f800000;
  auVar92 = vfnmadd213ps_fma(auVar91,auVar90,auVar211);
  auVar93 = vfmadd132ps_fma(auVar92,auVar90,auVar90);
  auVar90 = vrcp14ps_avx512vl(auVar88);
  auVar92 = vfnmadd213ps_fma(auVar88,auVar90,auVar211);
  auVar98 = vfmadd132ps_fma(auVar92,auVar90,auVar90);
  auVar90 = vrcp14ps_avx512vl(auVar89);
  auVar92 = vfnmadd213ps_fma(auVar89,auVar90,auVar211);
  auVar19 = vfmadd132ps_fma(auVar92,auVar90,auVar90);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar81 * 7 + 6);
  auVar92 = vpmovsxwd_avx(auVar92);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,auVar230);
  auVar203._0_4_ = auVar93._0_4_ * auVar92._0_4_;
  auVar203._4_4_ = auVar93._4_4_ * auVar92._4_4_;
  auVar203._8_4_ = auVar93._8_4_ * auVar92._8_4_;
  auVar203._12_4_ = auVar93._12_4_ * auVar92._12_4_;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar81 * 9 + 6);
  auVar92 = vpmovsxwd_avx(auVar90);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,auVar230);
  auVar91 = vpbroadcastd_avx512vl();
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 6);
  auVar90 = vpmovsxwd_avx(auVar95);
  auVar169._0_4_ = auVar93._0_4_ * auVar92._0_4_;
  auVar169._4_4_ = auVar93._4_4_ * auVar92._4_4_;
  auVar169._8_4_ = auVar93._8_4_ * auVar92._8_4_;
  auVar169._12_4_ = auVar93._12_4_ * auVar92._12_4_;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar81 * -2 + 6);
  auVar92 = vpmovsxwd_avx(auVar93);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,auVar20);
  auVar212._0_4_ = auVar98._0_4_ * auVar92._0_4_;
  auVar212._4_4_ = auVar98._4_4_ * auVar92._4_4_;
  auVar212._8_4_ = auVar98._8_4_ * auVar92._8_4_;
  auVar212._12_4_ = auVar98._12_4_ * auVar92._12_4_;
  auVar213 = ZEXT1664(auVar212);
  auVar92 = vcvtdq2ps_avx(auVar90);
  auVar92 = vsubps_avx(auVar92,auVar20);
  auVar165._0_4_ = auVar98._0_4_ * auVar92._0_4_;
  auVar165._4_4_ = auVar98._4_4_ * auVar92._4_4_;
  auVar165._8_4_ = auVar98._8_4_ * auVar92._8_4_;
  auVar165._12_4_ = auVar98._12_4_ * auVar92._12_4_;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = *(ulong *)(prim + uVar77 + uVar81 + 6);
  auVar92 = vpmovsxwd_avx(auVar98);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,auVar94);
  auVar187._0_4_ = auVar19._0_4_ * auVar92._0_4_;
  auVar187._4_4_ = auVar19._4_4_ * auVar92._4_4_;
  auVar187._8_4_ = auVar19._8_4_ * auVar92._8_4_;
  auVar187._12_4_ = auVar19._12_4_ * auVar92._12_4_;
  auVar230._8_8_ = 0;
  auVar230._0_8_ = *(ulong *)(prim + uVar81 * 0x17 + 6);
  auVar92 = vpmovsxwd_avx(auVar230);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,auVar94);
  auVar152._0_4_ = auVar19._0_4_ * auVar92._0_4_;
  auVar152._4_4_ = auVar19._4_4_ * auVar92._4_4_;
  auVar152._8_4_ = auVar19._8_4_ * auVar92._8_4_;
  auVar152._12_4_ = auVar19._12_4_ * auVar92._12_4_;
  auVar92 = vpminsd_avx(auVar203,auVar169);
  auVar90 = vpminsd_avx(auVar212,auVar165);
  auVar92 = vmaxps_avx(auVar92,auVar90);
  auVar90 = vpminsd_avx(auVar187,auVar152);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar19._4_4_ = uVar3;
  auVar19._0_4_ = uVar3;
  auVar19._8_4_ = uVar3;
  auVar19._12_4_ = uVar3;
  auVar90 = vmaxps_avx512vl(auVar90,auVar19);
  auVar92 = vmaxps_avx(auVar92,auVar90);
  auVar20._8_4_ = 0x3f7ffffa;
  auVar20._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar20._12_4_ = 0x3f7ffffa;
  local_2f0 = vmulps_avx512vl(auVar92,auVar20);
  auVar183 = ZEXT1664(local_2f0);
  auVar92 = vpmaxsd_avx(auVar203,auVar169);
  auVar90 = vpmaxsd_avx(auVar212,auVar165);
  auVar92 = vminps_avx(auVar92,auVar90);
  auVar90 = vpmaxsd_avx(auVar187,auVar152);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar94._4_4_ = uVar3;
  auVar94._0_4_ = uVar3;
  auVar94._8_4_ = uVar3;
  auVar94._12_4_ = uVar3;
  auVar90 = vminps_avx512vl(auVar90,auVar94);
  auVar92 = vminps_avx(auVar92,auVar90);
  auVar96._8_4_ = 0x3f800003;
  auVar96._0_8_ = 0x3f8000033f800003;
  auVar96._12_4_ = 0x3f800003;
  auVar92 = vmulps_avx512vl(auVar92,auVar96);
  uVar150 = vcmpps_avx512vl(local_2f0,auVar92,2);
  uVar84 = vpcmpgtd_avx512vl(auVar91,_DAT_01ff0cf0);
  uVar84 = ((byte)uVar150 & 0xf) & uVar84;
  if ((char)uVar84 != '\0') {
    local_6e8 = (undefined1 (*) [32])&local_1e0;
    local_2e0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    do {
      auVar181 = auVar213._0_32_;
      auVar123 = auVar183._0_32_;
      local_620 = in_ZMM21._0_32_;
      local_600 = in_ZMM20._0_32_;
      lVar22 = 0;
      for (uVar77 = uVar84; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000) {
        lVar22 = lVar22 + 1;
      }
      uVar84 = uVar84 - 1 & uVar84;
      uVar3 = *(undefined4 *)(prim + lVar22 * 4 + 6);
      uVar77 = (ulong)(uint)((int)lVar22 << 6);
      uVar83 = *(uint *)(prim + 2);
      pGVar9 = (context->scene->geometries).items[uVar83].ptr;
      auVar92 = *(undefined1 (*) [16])(prim + uVar77 + lVar60 + 0x16);
      if (uVar84 != 0) {
        uVar80 = uVar84 - 1 & uVar84;
        for (uVar81 = uVar84; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
        }
        if (uVar80 != 0) {
          for (; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
          }
        }
      }
      local_670 = *(undefined1 (*) [16])(prim + uVar77 + lVar60 + 0x26);
      local_680 = *(undefined1 (*) [16])(prim + uVar77 + lVar60 + 0x36);
      _local_690 = *(undefined1 (*) [16])(prim + uVar77 + lVar60 + 0x46);
      local_560 = (uint)pGVar9;
      uStack_55c = (uint)((ulong)pGVar9 >> 0x20);
      iVar7 = (int)pGVar9[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar90 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20))
                              ,0x1c);
      auVar90 = vinsertps_avx(auVar90,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar93 = vsubps_avx512vl(auVar92,auVar90);
      uVar149 = auVar93._0_4_;
      auVar170._4_4_ = uVar149;
      auVar170._0_4_ = uVar149;
      auVar170._8_4_ = uVar149;
      auVar170._12_4_ = uVar149;
      auVar95 = vshufps_avx(auVar93,auVar93,0x55);
      auVar93 = vshufps_avx(auVar93,auVar93,0xaa);
      aVar4 = pre->ray_space[k].vx.field_0;
      aVar5 = pre->ray_space[k].vy.field_0;
      fVar185 = pre->ray_space[k].vz.field_0.m128[0];
      fVar200 = pre->ray_space[k].vz.field_0.m128[1];
      fVar201 = pre->ray_space[k].vz.field_0.m128[2];
      fVar202 = pre->ray_space[k].vz.field_0.m128[3];
      auVar216._0_4_ = fVar185 * auVar93._0_4_;
      auVar216._4_4_ = fVar200 * auVar93._4_4_;
      auVar216._8_4_ = fVar201 * auVar93._8_4_;
      auVar216._12_4_ = fVar202 * auVar93._12_4_;
      auVar95 = vfmadd231ps_fma(auVar216,(undefined1  [16])aVar5,auVar95);
      auVar98 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar4,auVar170);
      auVar94 = vshufps_avx512vl(auVar92,auVar92,0xff);
      auVar93 = vsubps_avx(local_670,auVar90);
      uVar149 = auVar93._0_4_;
      auVar179._4_4_ = uVar149;
      auVar179._0_4_ = uVar149;
      auVar179._8_4_ = uVar149;
      auVar179._12_4_ = uVar149;
      auVar95 = vshufps_avx(auVar93,auVar93,0x55);
      auVar93 = vshufps_avx(auVar93,auVar93,0xaa);
      auVar218._0_4_ = fVar185 * auVar93._0_4_;
      auVar218._4_4_ = fVar200 * auVar93._4_4_;
      auVar218._8_4_ = fVar201 * auVar93._8_4_;
      auVar218._12_4_ = fVar202 * auVar93._12_4_;
      auVar95 = vfmadd231ps_fma(auVar218,(undefined1  [16])aVar5,auVar95);
      auVar230 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar4,auVar179);
      auVar93 = vsubps_avx512vl(local_680,auVar90);
      uVar149 = auVar93._0_4_;
      auVar180._4_4_ = uVar149;
      auVar180._0_4_ = uVar149;
      auVar180._8_4_ = uVar149;
      auVar180._12_4_ = uVar149;
      auVar95 = vshufps_avx(auVar93,auVar93,0x55);
      auVar93 = vshufps_avx(auVar93,auVar93,0xaa);
      auVar220._0_4_ = fVar185 * auVar93._0_4_;
      auVar220._4_4_ = fVar200 * auVar93._4_4_;
      auVar220._8_4_ = fVar201 * auVar93._8_4_;
      auVar220._12_4_ = fVar202 * auVar93._12_4_;
      auVar95 = vfmadd231ps_fma(auVar220,(undefined1  [16])aVar5,auVar95);
      auVar93 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar4,auVar180);
      auVar95 = vsubps_avx512vl(_local_690,auVar90);
      uVar149 = auVar95._0_4_;
      auVar171._4_4_ = uVar149;
      auVar171._0_4_ = uVar149;
      auVar171._8_4_ = uVar149;
      auVar171._12_4_ = uVar149;
      auVar90 = vshufps_avx(auVar95,auVar95,0x55);
      auVar95 = vshufps_avx(auVar95,auVar95,0xaa);
      auVar221._0_4_ = fVar185 * auVar95._0_4_;
      auVar221._4_4_ = fVar200 * auVar95._4_4_;
      auVar221._8_4_ = fVar201 * auVar95._8_4_;
      auVar221._12_4_ = fVar202 * auVar95._12_4_;
      auVar90 = vfmadd231ps_fma(auVar221,(undefined1  [16])aVar5,auVar90);
      auVar19 = vfmadd231ps_fma(auVar90,(undefined1  [16])aVar4,auVar171);
      lVar22 = (long)iVar7 * 0x44;
      auVar112 = *(undefined1 (*) [32])(bspline_basis0 + lVar22);
      uVar149 = auVar98._0_4_;
      local_520._4_4_ = uVar149;
      local_520._0_4_ = uVar149;
      local_520._8_4_ = uVar149;
      local_520._12_4_ = uVar149;
      local_520._16_4_ = uVar149;
      local_520._20_4_ = uVar149;
      local_520._24_4_ = uVar149;
      local_520._28_4_ = uVar149;
      auVar99._8_4_ = 1;
      auVar99._0_8_ = 0x100000001;
      auVar99._12_4_ = 1;
      auVar99._16_4_ = 1;
      auVar99._20_4_ = 1;
      auVar99._24_4_ = 1;
      auVar99._28_4_ = 1;
      local_6c0 = vpermps_avx512vl(auVar99,ZEXT1632(auVar98));
      auVar113 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x484);
      local_6e0 = vbroadcastss_avx512vl(auVar230);
      local_320 = vpermps_avx2(auVar99,ZEXT1632(auVar230));
      auVar111 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x908);
      local_80 = vbroadcastss_avx512vl(auVar93);
      local_a0 = vpermps_avx512vl(auVar99,ZEXT1632(auVar93));
      auVar110 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0xd8c);
      local_640 = vbroadcastss_avx512vl(auVar19);
      auVar232 = ZEXT3264(local_640);
      local_660 = vpermps_avx512vl(auVar99,ZEXT1632(auVar19));
      auVar233 = ZEXT3264(local_660);
      auVar99 = vmulps_avx512vl(local_640,auVar110);
      auVar100 = vmulps_avx512vl(local_660,auVar110);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar111,local_80);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar111,local_a0);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar113,local_6e0);
      auVar90 = vfmadd231ps_fma(auVar100,auVar113,local_320);
      auVar101 = vfmadd231ps_avx512vl(auVar99,auVar112,local_520);
      auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar112,local_6c0);
      auVar99 = *(undefined1 (*) [32])(bspline_basis1 + lVar22);
      auVar100 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x484);
      auVar109 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x908);
      auVar108 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0xd8c);
      auVar103 = vmulps_avx512vl(local_640,auVar108);
      auVar104 = vmulps_avx512vl(local_660,auVar108);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar109,local_80);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar109,local_a0);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar100,local_6e0);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar100,local_320);
      auVar20 = vfmadd231ps_fma(auVar103,auVar99,local_520);
      auVar103 = vfmadd231ps_avx512vl(auVar104,auVar99,local_6c0);
      local_500 = vsubps_avx512vl(ZEXT1632(auVar20),auVar101);
      local_540 = vsubps_avx(auVar103,auVar102);
      auVar104 = vmulps_avx512vl(auVar102,local_500);
      auVar105 = vmulps_avx512vl(auVar101,local_540);
      auVar104 = vsubps_avx512vl(auVar104,auVar105);
      auVar90 = vshufps_avx(local_670,local_670,0xff);
      uVar150 = auVar94._0_8_;
      local_c0._8_8_ = uVar150;
      local_c0._0_8_ = uVar150;
      local_c0._16_8_ = uVar150;
      local_c0._24_8_ = uVar150;
      local_e0 = vbroadcastsd_avx512vl(auVar90);
      auVar90 = vshufps_avx512vl(local_680,local_680,0xff);
      local_100 = vbroadcastsd_avx512vl(auVar90);
      auVar90 = vshufps_avx512vl(_local_690,_local_690,0xff);
      uVar150 = auVar90._0_8_;
      register0x00001248 = uVar150;
      local_120 = uVar150;
      register0x00001250 = uVar150;
      register0x00001258 = uVar150;
      auVar105 = vmulps_avx512vl(_local_120,auVar110);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar111,local_100);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar113,local_e0);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar112,local_c0);
      auVar106 = vmulps_avx512vl(_local_120,auVar108);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar109,local_100);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar100,local_e0);
      auVar94 = vfmadd231ps_fma(auVar106,auVar99,local_c0);
      auVar106 = vmulps_avx512vl(local_540,local_540);
      auVar106 = vfmadd231ps_avx512vl(auVar106,local_500,local_500);
      auVar107 = vmaxps_avx512vl(auVar105,ZEXT1632(auVar94));
      auVar107 = vmulps_avx512vl(auVar107,auVar107);
      auVar106 = vmulps_avx512vl(auVar107,auVar106);
      auVar104 = vmulps_avx512vl(auVar104,auVar104);
      uVar150 = vcmpps_avx512vl(auVar104,auVar106,2);
      auVar90 = vblendps_avx(auVar98,auVar92,8);
      auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar95 = vandps_avx512vl(auVar90,auVar96);
      auVar90 = vblendps_avx(auVar230,local_670,8);
      auVar90 = vandps_avx512vl(auVar90,auVar96);
      auVar95 = vmaxps_avx(auVar95,auVar90);
      auVar90 = vblendps_avx(auVar93,local_680,8);
      auVar91 = vandps_avx512vl(auVar90,auVar96);
      auVar90 = vblendps_avx(auVar19,_local_690,8);
      auVar90 = vandps_avx512vl(auVar90,auVar96);
      auVar90 = vmaxps_avx(auVar91,auVar90);
      auVar90 = vmaxps_avx(auVar95,auVar90);
      auVar95 = vmovshdup_avx(auVar90);
      auVar95 = vmaxss_avx(auVar95,auVar90);
      auVar90 = vshufpd_avx(auVar90,auVar90,1);
      auVar90 = vmaxss_avx(auVar90,auVar95);
      auVar95 = vcvtsi2ss_avx512f(_local_690,iVar7);
      local_4e0._0_16_ = auVar95;
      auVar106._0_4_ = auVar95._0_4_;
      auVar106._4_4_ = auVar106._0_4_;
      auVar106._8_4_ = auVar106._0_4_;
      auVar106._12_4_ = auVar106._0_4_;
      auVar106._16_4_ = auVar106._0_4_;
      auVar106._20_4_ = auVar106._0_4_;
      auVar106._24_4_ = auVar106._0_4_;
      auVar106._28_4_ = auVar106._0_4_;
      uVar21 = vcmpps_avx512vl(auVar106,_DAT_02020f40,0xe);
      bVar85 = (byte)uVar150 & (byte)uVar21;
      auVar90 = vmulss_avx512f(auVar90,ZEXT416(0x35000000));
      auVar104._8_4_ = 2;
      auVar104._0_8_ = 0x200000002;
      auVar104._12_4_ = 2;
      auVar104._16_4_ = 2;
      auVar104._20_4_ = 2;
      auVar104._24_4_ = 2;
      auVar104._28_4_ = 2;
      local_140 = vpermps_avx512vl(auVar104,ZEXT1632(auVar98));
      local_160 = vpermps_avx512vl(auVar104,ZEXT1632(auVar230));
      local_180 = vpermps_avx512vl(auVar104,ZEXT1632(auVar93));
      local_1a0 = vpermps_avx2(auVar104,ZEXT1632(auVar19));
      uVar217 = *(uint *)(ray + k * 4 + 0x60);
      auVar95 = local_80._0_16_;
      if (bVar85 == 0) {
        auVar95 = vxorps_avx512vl(auVar95,auVar95);
        auVar231 = ZEXT1664(auVar95);
        auVar213 = ZEXT3264(auVar181);
        in_ZMM20 = ZEXT3264(local_600);
        auVar183 = ZEXT3264(auVar123);
        in_ZMM21 = ZEXT3264(local_620);
        auVar229 = ZEXT3264(local_520);
        auVar228 = ZEXT3264(local_6c0);
        auVar227 = ZEXT3264(local_6e0);
      }
      else {
        _local_580 = ZEXT416(uVar217);
        auVar108 = vmulps_avx512vl(local_1a0,auVar108);
        auVar109 = vfmadd213ps_avx512vl(auVar109,local_180,auVar108);
        auVar100 = vfmadd213ps_avx512vl(auVar100,local_160,auVar109);
        auVar108 = vfmadd213ps_avx512vl(auVar99,local_140,auVar100);
        auVar110 = vmulps_avx512vl(local_1a0,auVar110);
        auVar111 = vfmadd213ps_avx512vl(auVar111,local_180,auVar110);
        auVar100 = vfmadd213ps_avx512vl(auVar113,local_160,auVar111);
        auVar113 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x1210);
        auVar111 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x1694);
        auVar110 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x1b18);
        auVar99 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x1f9c);
        auVar104 = vfmadd213ps_avx512vl(auVar112,local_140,auVar100);
        auVar112 = vmulps_avx512vl(local_640,auVar99);
        auVar100 = vmulps_avx512vl(local_660,auVar99);
        auVar99 = vmulps_avx512vl(local_1a0,auVar99);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar110,local_80);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar110,local_a0);
        auVar110 = vfmadd231ps_avx512vl(auVar99,local_180,auVar110);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar111,local_6e0);
        auVar93 = vfmadd231ps_fma(auVar100,auVar111,local_320);
        auVar99 = vfmadd231ps_avx512vl(auVar110,local_160,auVar111);
        auVar100 = vfmadd231ps_avx512vl(auVar112,auVar113,local_520);
        auVar228 = ZEXT3264(local_6c0);
        auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),auVar113,local_6c0);
        auVar112 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x1210);
        auVar111 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x1b18);
        auVar110 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x1f9c);
        auVar99 = vfmadd231ps_avx512vl(auVar99,local_140,auVar113);
        auVar113 = vmulps_avx512vl(local_640,auVar110);
        auVar107 = vmulps_avx512vl(local_660,auVar110);
        auVar110 = vmulps_avx512vl(local_1a0,auVar110);
        auVar114 = vfmadd231ps_avx512vl(auVar113,auVar111,local_80);
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar111,local_a0);
        auVar111 = vfmadd231ps_avx512vl(auVar110,local_180,auVar111);
        auVar113 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x1694);
        auVar110 = vfmadd231ps_avx512vl(auVar114,auVar113,local_6e0);
        auVar93 = vfmadd231ps_fma(auVar107,auVar113,local_320);
        auVar113 = vfmadd231ps_avx512vl(auVar111,local_160,auVar113);
        auVar111 = vfmadd231ps_avx512vl(auVar110,auVar112,local_520);
        auVar110 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),auVar112,local_6c0);
        auVar107 = vfmadd231ps_avx512vl(auVar113,local_140,auVar112);
        auVar225._8_4_ = 0x7fffffff;
        auVar225._0_8_ = 0x7fffffff7fffffff;
        auVar225._12_4_ = 0x7fffffff;
        auVar225._16_4_ = 0x7fffffff;
        auVar225._20_4_ = 0x7fffffff;
        auVar225._24_4_ = 0x7fffffff;
        auVar225._28_4_ = 0x7fffffff;
        auVar112 = vandps_avx(auVar100,auVar225);
        auVar113 = vandps_avx(auVar109,auVar225);
        auVar113 = vmaxps_avx(auVar112,auVar113);
        auVar112 = vandps_avx(auVar99,auVar225);
        auVar112 = vmaxps_avx(auVar113,auVar112);
        auVar99 = vbroadcastss_avx512vl(auVar90);
        uVar77 = vcmpps_avx512vl(auVar112,auVar99,1);
        bVar12 = (bool)((byte)uVar77 & 1);
        auVar114._0_4_ = (float)((uint)bVar12 * local_500._0_4_ | (uint)!bVar12 * auVar100._0_4_);
        bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar114._4_4_ = (float)((uint)bVar12 * local_500._4_4_ | (uint)!bVar12 * auVar100._4_4_);
        bVar12 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar114._8_4_ = (float)((uint)bVar12 * local_500._8_4_ | (uint)!bVar12 * auVar100._8_4_);
        bVar12 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar114._12_4_ = (float)((uint)bVar12 * local_500._12_4_ | (uint)!bVar12 * auVar100._12_4_)
        ;
        bVar12 = (bool)((byte)(uVar77 >> 4) & 1);
        auVar114._16_4_ = (float)((uint)bVar12 * local_500._16_4_ | (uint)!bVar12 * auVar100._16_4_)
        ;
        bVar12 = (bool)((byte)(uVar77 >> 5) & 1);
        auVar114._20_4_ = (float)((uint)bVar12 * local_500._20_4_ | (uint)!bVar12 * auVar100._20_4_)
        ;
        bVar12 = (bool)((byte)(uVar77 >> 6) & 1);
        auVar114._24_4_ = (float)((uint)bVar12 * local_500._24_4_ | (uint)!bVar12 * auVar100._24_4_)
        ;
        bVar12 = SUB81(uVar77 >> 7,0);
        auVar114._28_4_ = (uint)bVar12 * local_500._28_4_ | (uint)!bVar12 * auVar100._28_4_;
        bVar12 = (bool)((byte)uVar77 & 1);
        auVar125._0_4_ = (float)((uint)bVar12 * local_540._0_4_ | (uint)!bVar12 * auVar109._0_4_);
        bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar125._4_4_ = (float)((uint)bVar12 * local_540._4_4_ | (uint)!bVar12 * auVar109._4_4_);
        bVar12 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar125._8_4_ = (float)((uint)bVar12 * local_540._8_4_ | (uint)!bVar12 * auVar109._8_4_);
        bVar12 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar125._12_4_ = (float)((uint)bVar12 * local_540._12_4_ | (uint)!bVar12 * auVar109._12_4_)
        ;
        bVar12 = (bool)((byte)(uVar77 >> 4) & 1);
        auVar125._16_4_ = (float)((uint)bVar12 * local_540._16_4_ | (uint)!bVar12 * auVar109._16_4_)
        ;
        bVar12 = (bool)((byte)(uVar77 >> 5) & 1);
        auVar125._20_4_ = (float)((uint)bVar12 * local_540._20_4_ | (uint)!bVar12 * auVar109._20_4_)
        ;
        bVar12 = (bool)((byte)(uVar77 >> 6) & 1);
        auVar125._24_4_ = (float)((uint)bVar12 * local_540._24_4_ | (uint)!bVar12 * auVar109._24_4_)
        ;
        bVar12 = SUB81(uVar77 >> 7,0);
        auVar125._28_4_ = (uint)bVar12 * local_540._28_4_ | (uint)!bVar12 * auVar109._28_4_;
        auVar112 = vandps_avx(auVar225,auVar111);
        auVar113 = vandps_avx(auVar110,auVar225);
        auVar113 = vmaxps_avx(auVar112,auVar113);
        auVar112 = vandps_avx(auVar107,auVar225);
        auVar112 = vmaxps_avx(auVar113,auVar112);
        uVar77 = vcmpps_avx512vl(auVar112,auVar99,1);
        bVar12 = (bool)((byte)uVar77 & 1);
        auVar115._0_4_ = (float)((uint)bVar12 * local_500._0_4_ | (uint)!bVar12 * auVar111._0_4_);
        bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar115._4_4_ = (float)((uint)bVar12 * local_500._4_4_ | (uint)!bVar12 * auVar111._4_4_);
        bVar12 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar115._8_4_ = (float)((uint)bVar12 * local_500._8_4_ | (uint)!bVar12 * auVar111._8_4_);
        bVar12 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar115._12_4_ = (float)((uint)bVar12 * local_500._12_4_ | (uint)!bVar12 * auVar111._12_4_)
        ;
        bVar12 = (bool)((byte)(uVar77 >> 4) & 1);
        auVar115._16_4_ = (float)((uint)bVar12 * local_500._16_4_ | (uint)!bVar12 * auVar111._16_4_)
        ;
        bVar12 = (bool)((byte)(uVar77 >> 5) & 1);
        auVar115._20_4_ = (float)((uint)bVar12 * local_500._20_4_ | (uint)!bVar12 * auVar111._20_4_)
        ;
        bVar12 = (bool)((byte)(uVar77 >> 6) & 1);
        auVar115._24_4_ = (float)((uint)bVar12 * local_500._24_4_ | (uint)!bVar12 * auVar111._24_4_)
        ;
        bVar12 = SUB81(uVar77 >> 7,0);
        auVar115._28_4_ = (uint)bVar12 * local_500._28_4_ | (uint)!bVar12 * auVar111._28_4_;
        bVar12 = (bool)((byte)uVar77 & 1);
        auVar116._0_4_ = (float)((uint)bVar12 * local_540._0_4_ | (uint)!bVar12 * auVar110._0_4_);
        bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar116._4_4_ = (float)((uint)bVar12 * local_540._4_4_ | (uint)!bVar12 * auVar110._4_4_);
        bVar12 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar116._8_4_ = (float)((uint)bVar12 * local_540._8_4_ | (uint)!bVar12 * auVar110._8_4_);
        bVar12 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar116._12_4_ = (float)((uint)bVar12 * local_540._12_4_ | (uint)!bVar12 * auVar110._12_4_)
        ;
        bVar12 = (bool)((byte)(uVar77 >> 4) & 1);
        auVar116._16_4_ = (float)((uint)bVar12 * local_540._16_4_ | (uint)!bVar12 * auVar110._16_4_)
        ;
        bVar12 = (bool)((byte)(uVar77 >> 5) & 1);
        auVar116._20_4_ = (float)((uint)bVar12 * local_540._20_4_ | (uint)!bVar12 * auVar110._20_4_)
        ;
        bVar12 = (bool)((byte)(uVar77 >> 6) & 1);
        auVar116._24_4_ = (float)((uint)bVar12 * local_540._24_4_ | (uint)!bVar12 * auVar110._24_4_)
        ;
        bVar12 = SUB81(uVar77 >> 7,0);
        auVar116._28_4_ = (uint)bVar12 * local_540._28_4_ | (uint)!bVar12 * auVar110._28_4_;
        auVar97 = vxorps_avx512vl(auVar95,auVar95);
        auVar231 = ZEXT1664(auVar97);
        auVar112 = vfmadd213ps_avx512vl(auVar114,auVar114,ZEXT1632(auVar97));
        auVar95 = vfmadd231ps_fma(auVar112,auVar125,auVar125);
        auVar111 = vrsqrt14ps_avx512vl(ZEXT1632(auVar95));
        fVar185 = auVar111._0_4_;
        fVar200 = auVar111._4_4_;
        fVar201 = auVar111._8_4_;
        fVar202 = auVar111._12_4_;
        fVar176 = auVar111._16_4_;
        fVar184 = auVar111._20_4_;
        fVar86 = auVar111._24_4_;
        auVar112._4_4_ = fVar200 * fVar200 * fVar200 * auVar95._4_4_ * -0.5;
        auVar112._0_4_ = fVar185 * fVar185 * fVar185 * auVar95._0_4_ * -0.5;
        auVar112._8_4_ = fVar201 * fVar201 * fVar201 * auVar95._8_4_ * -0.5;
        auVar112._12_4_ = fVar202 * fVar202 * fVar202 * auVar95._12_4_ * -0.5;
        auVar112._16_4_ = fVar176 * fVar176 * fVar176 * -0.0;
        auVar112._20_4_ = fVar184 * fVar184 * fVar184 * -0.0;
        auVar112._24_4_ = fVar86 * fVar86 * fVar86 * -0.0;
        auVar112._28_4_ = 0;
        auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar99,auVar111);
        auVar113._4_4_ = auVar125._4_4_ * auVar112._4_4_;
        auVar113._0_4_ = auVar125._0_4_ * auVar112._0_4_;
        auVar113._8_4_ = auVar125._8_4_ * auVar112._8_4_;
        auVar113._12_4_ = auVar125._12_4_ * auVar112._12_4_;
        auVar113._16_4_ = auVar125._16_4_ * auVar112._16_4_;
        auVar113._20_4_ = auVar125._20_4_ * auVar112._20_4_;
        auVar113._24_4_ = auVar125._24_4_ * auVar112._24_4_;
        auVar113._28_4_ = auVar111._28_4_;
        auVar111._4_4_ = auVar112._4_4_ * -auVar114._4_4_;
        auVar111._0_4_ = auVar112._0_4_ * -auVar114._0_4_;
        auVar111._8_4_ = auVar112._8_4_ * -auVar114._8_4_;
        auVar111._12_4_ = auVar112._12_4_ * -auVar114._12_4_;
        auVar111._16_4_ = auVar112._16_4_ * -auVar114._16_4_;
        auVar111._20_4_ = auVar112._20_4_ * -auVar114._20_4_;
        auVar111._24_4_ = auVar112._24_4_ * -auVar114._24_4_;
        auVar111._28_4_ = auVar114._28_4_ ^ 0x80000000;
        auVar107 = vmulps_avx512vl(auVar112,ZEXT1632(auVar97));
        auVar114 = ZEXT1632(auVar97);
        auVar110 = vfmadd213ps_avx512vl(auVar115,auVar115,auVar114);
        auVar95 = vfmadd231ps_fma(auVar110,auVar116,auVar116);
        auVar109 = vrsqrt14ps_avx512vl(ZEXT1632(auVar95));
        fVar185 = auVar109._0_4_;
        fVar200 = auVar109._4_4_;
        fVar201 = auVar109._8_4_;
        fVar202 = auVar109._12_4_;
        fVar176 = auVar109._16_4_;
        fVar184 = auVar109._20_4_;
        fVar86 = auVar109._24_4_;
        auVar110._4_4_ = fVar200 * fVar200 * fVar200 * auVar95._4_4_ * -0.5;
        auVar110._0_4_ = fVar185 * fVar185 * fVar185 * auVar95._0_4_ * -0.5;
        auVar110._8_4_ = fVar201 * fVar201 * fVar201 * auVar95._8_4_ * -0.5;
        auVar110._12_4_ = fVar202 * fVar202 * fVar202 * auVar95._12_4_ * -0.5;
        auVar110._16_4_ = fVar176 * fVar176 * fVar176 * -0.0;
        auVar110._20_4_ = fVar184 * fVar184 * fVar184 * -0.0;
        auVar110._24_4_ = fVar86 * fVar86 * fVar86 * -0.0;
        auVar110._28_4_ = 0;
        auVar110 = vfmadd231ps_avx512vl(auVar110,auVar99,auVar109);
        auVar100._4_4_ = auVar116._4_4_ * auVar110._4_4_;
        auVar100._0_4_ = auVar116._0_4_ * auVar110._0_4_;
        auVar100._8_4_ = auVar116._8_4_ * auVar110._8_4_;
        auVar100._12_4_ = auVar116._12_4_ * auVar110._12_4_;
        auVar100._16_4_ = auVar116._16_4_ * auVar110._16_4_;
        auVar100._20_4_ = auVar116._20_4_ * auVar110._20_4_;
        auVar100._24_4_ = auVar116._24_4_ * auVar110._24_4_;
        auVar100._28_4_ = auVar109._28_4_;
        auVar109._4_4_ = -auVar115._4_4_ * auVar110._4_4_;
        auVar109._0_4_ = -auVar115._0_4_ * auVar110._0_4_;
        auVar109._8_4_ = -auVar115._8_4_ * auVar110._8_4_;
        auVar109._12_4_ = -auVar115._12_4_ * auVar110._12_4_;
        auVar109._16_4_ = -auVar115._16_4_ * auVar110._16_4_;
        auVar109._20_4_ = -auVar115._20_4_ * auVar110._20_4_;
        auVar109._24_4_ = -auVar115._24_4_ * auVar110._24_4_;
        auVar109._28_4_ = auVar112._28_4_;
        auVar112 = vmulps_avx512vl(auVar110,auVar114);
        auVar95 = vfmadd213ps_fma(auVar113,auVar105,auVar101);
        auVar93 = vfmadd213ps_fma(auVar111,auVar105,auVar102);
        auVar110 = vfmadd213ps_avx512vl(auVar107,auVar105,auVar104);
        auVar99 = vfmadd213ps_avx512vl(auVar100,ZEXT1632(auVar94),ZEXT1632(auVar20));
        auVar96 = vfnmadd213ps_fma(auVar113,auVar105,auVar101);
        auVar101 = ZEXT1632(auVar94);
        auVar98 = vfmadd213ps_fma(auVar109,auVar101,auVar103);
        auVar91 = vfnmadd213ps_fma(auVar111,auVar105,auVar102);
        auVar230 = vfmadd213ps_fma(auVar112,auVar101,auVar108);
        auVar113 = vfnmadd231ps_avx512vl(auVar104,auVar105,auVar107);
        auVar89 = vfnmadd213ps_fma(auVar100,auVar101,ZEXT1632(auVar20));
        auVar88 = vfnmadd213ps_fma(auVar109,auVar101,auVar103);
        auVar151 = vfnmadd231ps_fma(auVar108,ZEXT1632(auVar94),auVar112);
        auVar111 = vsubps_avx512vl(auVar99,ZEXT1632(auVar96));
        auVar112 = vsubps_avx(ZEXT1632(auVar98),ZEXT1632(auVar91));
        auVar100 = vsubps_avx512vl(ZEXT1632(auVar230),auVar113);
        auVar109 = vmulps_avx512vl(auVar112,auVar113);
        auVar19 = vfmsub231ps_fma(auVar109,ZEXT1632(auVar91),auVar100);
        auVar108._4_4_ = auVar96._4_4_ * auVar100._4_4_;
        auVar108._0_4_ = auVar96._0_4_ * auVar100._0_4_;
        auVar108._8_4_ = auVar96._8_4_ * auVar100._8_4_;
        auVar108._12_4_ = auVar96._12_4_ * auVar100._12_4_;
        auVar108._16_4_ = auVar100._16_4_ * 0.0;
        auVar108._20_4_ = auVar100._20_4_ * 0.0;
        auVar108._24_4_ = auVar100._24_4_ * 0.0;
        auVar108._28_4_ = auVar100._28_4_;
        auVar100 = vfmsub231ps_avx512vl(auVar108,auVar113,auVar111);
        auVar101._4_4_ = auVar91._4_4_ * auVar111._4_4_;
        auVar101._0_4_ = auVar91._0_4_ * auVar111._0_4_;
        auVar101._8_4_ = auVar91._8_4_ * auVar111._8_4_;
        auVar101._12_4_ = auVar91._12_4_ * auVar111._12_4_;
        auVar101._16_4_ = auVar111._16_4_ * 0.0;
        auVar101._20_4_ = auVar111._20_4_ * 0.0;
        auVar101._24_4_ = auVar111._24_4_ * 0.0;
        auVar101._28_4_ = auVar111._28_4_;
        auVar20 = vfmsub231ps_fma(auVar101,ZEXT1632(auVar96),auVar112);
        auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar20),auVar114,auVar100);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar114,ZEXT1632(auVar19));
        auVar104 = ZEXT1632(auVar97);
        uVar77 = vcmpps_avx512vl(auVar112,auVar104,2);
        bVar76 = (byte)uVar77;
        fVar86 = (float)((uint)(bVar76 & 1) * auVar95._0_4_ |
                        (uint)!(bool)(bVar76 & 1) * auVar89._0_4_);
        bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
        fVar140 = (float)((uint)bVar12 * auVar95._4_4_ | (uint)!bVar12 * auVar89._4_4_);
        bVar12 = (bool)((byte)(uVar77 >> 2) & 1);
        fVar142 = (float)((uint)bVar12 * auVar95._8_4_ | (uint)!bVar12 * auVar89._8_4_);
        bVar12 = (bool)((byte)(uVar77 >> 3) & 1);
        fVar145 = (float)((uint)bVar12 * auVar95._12_4_ | (uint)!bVar12 * auVar89._12_4_);
        auVar109 = ZEXT1632(CONCAT412(fVar145,CONCAT48(fVar142,CONCAT44(fVar140,fVar86))));
        fVar87 = (float)((uint)(bVar76 & 1) * auVar93._0_4_ |
                        (uint)!(bool)(bVar76 & 1) * auVar88._0_4_);
        bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
        fVar141 = (float)((uint)bVar12 * auVar93._4_4_ | (uint)!bVar12 * auVar88._4_4_);
        bVar12 = (bool)((byte)(uVar77 >> 2) & 1);
        fVar143 = (float)((uint)bVar12 * auVar93._8_4_ | (uint)!bVar12 * auVar88._8_4_);
        bVar12 = (bool)((byte)(uVar77 >> 3) & 1);
        fVar146 = (float)((uint)bVar12 * auVar93._12_4_ | (uint)!bVar12 * auVar88._12_4_);
        auVar108 = ZEXT1632(CONCAT412(fVar146,CONCAT48(fVar143,CONCAT44(fVar141,fVar87))));
        auVar117._0_4_ =
             (float)((uint)(bVar76 & 1) * auVar110._0_4_ |
                    (uint)!(bool)(bVar76 & 1) * auVar151._0_4_);
        bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar117._4_4_ = (float)((uint)bVar12 * auVar110._4_4_ | (uint)!bVar12 * auVar151._4_4_);
        bVar12 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar117._8_4_ = (float)((uint)bVar12 * auVar110._8_4_ | (uint)!bVar12 * auVar151._8_4_);
        bVar12 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar117._12_4_ = (float)((uint)bVar12 * auVar110._12_4_ | (uint)!bVar12 * auVar151._12_4_);
        fVar185 = (float)((uint)((byte)(uVar77 >> 4) & 1) * auVar110._16_4_);
        auVar117._16_4_ = fVar185;
        fVar200 = (float)((uint)((byte)(uVar77 >> 5) & 1) * auVar110._20_4_);
        auVar117._20_4_ = fVar200;
        fVar201 = (float)((uint)((byte)(uVar77 >> 6) & 1) * auVar110._24_4_);
        auVar117._24_4_ = fVar201;
        iVar1 = (uint)(byte)(uVar77 >> 7) * auVar110._28_4_;
        auVar117._28_4_ = iVar1;
        auVar111 = vblendmps_avx512vl(ZEXT1632(auVar96),auVar99);
        auVar118._0_4_ =
             (uint)(bVar76 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar19._0_4_;
        bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar118._4_4_ = (uint)bVar12 * auVar111._4_4_ | (uint)!bVar12 * auVar19._4_4_;
        bVar12 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar118._8_4_ = (uint)bVar12 * auVar111._8_4_ | (uint)!bVar12 * auVar19._8_4_;
        bVar12 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar118._12_4_ = (uint)bVar12 * auVar111._12_4_ | (uint)!bVar12 * auVar19._12_4_;
        auVar118._16_4_ = (uint)((byte)(uVar77 >> 4) & 1) * auVar111._16_4_;
        auVar118._20_4_ = (uint)((byte)(uVar77 >> 5) & 1) * auVar111._20_4_;
        auVar118._24_4_ = (uint)((byte)(uVar77 >> 6) & 1) * auVar111._24_4_;
        auVar118._28_4_ = (uint)(byte)(uVar77 >> 7) * auVar111._28_4_;
        auVar111 = vblendmps_avx512vl(ZEXT1632(auVar91),ZEXT1632(auVar98));
        auVar119._0_4_ =
             (float)((uint)(bVar76 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar93._0_4_
                    );
        bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar119._4_4_ = (float)((uint)bVar12 * auVar111._4_4_ | (uint)!bVar12 * auVar93._4_4_);
        bVar12 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar119._8_4_ = (float)((uint)bVar12 * auVar111._8_4_ | (uint)!bVar12 * auVar93._8_4_);
        bVar12 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar119._12_4_ = (float)((uint)bVar12 * auVar111._12_4_ | (uint)!bVar12 * auVar93._12_4_);
        fVar202 = (float)((uint)((byte)(uVar77 >> 4) & 1) * auVar111._16_4_);
        auVar119._16_4_ = fVar202;
        fVar176 = (float)((uint)((byte)(uVar77 >> 5) & 1) * auVar111._20_4_);
        auVar119._20_4_ = fVar176;
        fVar184 = (float)((uint)((byte)(uVar77 >> 6) & 1) * auVar111._24_4_);
        auVar119._24_4_ = fVar184;
        auVar119._28_4_ = (uint)(byte)(uVar77 >> 7) * auVar111._28_4_;
        auVar111 = vblendmps_avx512vl(auVar113,ZEXT1632(auVar230));
        auVar120._0_4_ =
             (float)((uint)(bVar76 & 1) * auVar111._0_4_ |
                    (uint)!(bool)(bVar76 & 1) * auVar110._0_4_);
        bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar120._4_4_ = (float)((uint)bVar12 * auVar111._4_4_ | (uint)!bVar12 * auVar110._4_4_);
        bVar12 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar120._8_4_ = (float)((uint)bVar12 * auVar111._8_4_ | (uint)!bVar12 * auVar110._8_4_);
        bVar12 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar120._12_4_ = (float)((uint)bVar12 * auVar111._12_4_ | (uint)!bVar12 * auVar110._12_4_);
        bVar12 = (bool)((byte)(uVar77 >> 4) & 1);
        auVar120._16_4_ = (float)((uint)bVar12 * auVar111._16_4_ | (uint)!bVar12 * auVar110._16_4_);
        bVar12 = (bool)((byte)(uVar77 >> 5) & 1);
        auVar120._20_4_ = (float)((uint)bVar12 * auVar111._20_4_ | (uint)!bVar12 * auVar110._20_4_);
        bVar12 = (bool)((byte)(uVar77 >> 6) & 1);
        auVar120._24_4_ = (float)((uint)bVar12 * auVar111._24_4_ | (uint)!bVar12 * auVar110._24_4_);
        bVar12 = SUB81(uVar77 >> 7,0);
        auVar120._28_4_ = (uint)bVar12 * auVar111._28_4_ | (uint)!bVar12 * auVar110._28_4_;
        auVar121._0_4_ =
             (uint)(bVar76 & 1) * (int)auVar96._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar99._0_4_;
        bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar121._4_4_ = (uint)bVar12 * (int)auVar96._4_4_ | (uint)!bVar12 * auVar99._4_4_;
        bVar12 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar121._8_4_ = (uint)bVar12 * (int)auVar96._8_4_ | (uint)!bVar12 * auVar99._8_4_;
        bVar12 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar121._12_4_ = (uint)bVar12 * (int)auVar96._12_4_ | (uint)!bVar12 * auVar99._12_4_;
        auVar121._16_4_ = (uint)!(bool)((byte)(uVar77 >> 4) & 1) * auVar99._16_4_;
        auVar121._20_4_ = (uint)!(bool)((byte)(uVar77 >> 5) & 1) * auVar99._20_4_;
        auVar121._24_4_ = (uint)!(bool)((byte)(uVar77 >> 6) & 1) * auVar99._24_4_;
        auVar121._28_4_ = (uint)!SUB81(uVar77 >> 7,0) * auVar99._28_4_;
        bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
        bVar14 = (bool)((byte)(uVar77 >> 2) & 1);
        bVar15 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar122._0_4_ =
             (uint)(bVar76 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar230._0_4_;
        bVar13 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar122._4_4_ = (uint)bVar13 * auVar113._4_4_ | (uint)!bVar13 * auVar230._4_4_;
        bVar13 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar122._8_4_ = (uint)bVar13 * auVar113._8_4_ | (uint)!bVar13 * auVar230._8_4_;
        bVar13 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar122._12_4_ = (uint)bVar13 * auVar113._12_4_ | (uint)!bVar13 * auVar230._12_4_;
        auVar122._16_4_ = (uint)((byte)(uVar77 >> 4) & 1) * auVar113._16_4_;
        auVar122._20_4_ = (uint)((byte)(uVar77 >> 5) & 1) * auVar113._20_4_;
        auVar122._24_4_ = (uint)((byte)(uVar77 >> 6) & 1) * auVar113._24_4_;
        iVar2 = (uint)(byte)(uVar77 >> 7) * auVar113._28_4_;
        auVar122._28_4_ = iVar2;
        auVar101 = vsubps_avx512vl(auVar121,auVar109);
        auVar113 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar91._12_4_ |
                                                 (uint)!bVar15 * auVar98._12_4_,
                                                 CONCAT48((uint)bVar14 * (int)auVar91._8_4_ |
                                                          (uint)!bVar14 * auVar98._8_4_,
                                                          CONCAT44((uint)bVar12 * (int)auVar91._4_4_
                                                                   | (uint)!bVar12 * auVar98._4_4_,
                                                                   (uint)(bVar76 & 1) *
                                                                   (int)auVar91._0_4_ |
                                                                   (uint)!(bool)(bVar76 & 1) *
                                                                   auVar98._0_4_)))),auVar108);
        auVar111 = vsubps_avx(auVar122,auVar117);
        auVar110 = vsubps_avx(auVar109,auVar118);
        auVar99 = vsubps_avx(auVar108,auVar119);
        auVar100 = vsubps_avx(auVar117,auVar120);
        auVar102._4_4_ = auVar111._4_4_ * fVar140;
        auVar102._0_4_ = auVar111._0_4_ * fVar86;
        auVar102._8_4_ = auVar111._8_4_ * fVar142;
        auVar102._12_4_ = auVar111._12_4_ * fVar145;
        auVar102._16_4_ = auVar111._16_4_ * 0.0;
        auVar102._20_4_ = auVar111._20_4_ * 0.0;
        auVar102._24_4_ = auVar111._24_4_ * 0.0;
        auVar102._28_4_ = iVar2;
        auVar95 = vfmsub231ps_fma(auVar102,auVar117,auVar101);
        auVar103._4_4_ = fVar141 * auVar101._4_4_;
        auVar103._0_4_ = fVar87 * auVar101._0_4_;
        auVar103._8_4_ = fVar143 * auVar101._8_4_;
        auVar103._12_4_ = fVar146 * auVar101._12_4_;
        auVar103._16_4_ = auVar101._16_4_ * 0.0;
        auVar103._20_4_ = auVar101._20_4_ * 0.0;
        auVar103._24_4_ = auVar101._24_4_ * 0.0;
        auVar103._28_4_ = auVar112._28_4_;
        auVar93 = vfmsub231ps_fma(auVar103,auVar109,auVar113);
        auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),auVar104,ZEXT1632(auVar95));
        auVar194._0_4_ = auVar113._0_4_ * auVar117._0_4_;
        auVar194._4_4_ = auVar113._4_4_ * auVar117._4_4_;
        auVar194._8_4_ = auVar113._8_4_ * auVar117._8_4_;
        auVar194._12_4_ = auVar113._12_4_ * auVar117._12_4_;
        auVar194._16_4_ = auVar113._16_4_ * fVar185;
        auVar194._20_4_ = auVar113._20_4_ * fVar200;
        auVar194._24_4_ = auVar113._24_4_ * fVar201;
        auVar194._28_4_ = 0;
        auVar95 = vfmsub231ps_fma(auVar194,auVar108,auVar111);
        auVar102 = vfmadd231ps_avx512vl(auVar112,auVar104,ZEXT1632(auVar95));
        auVar112 = vmulps_avx512vl(auVar100,auVar118);
        auVar112 = vfmsub231ps_avx512vl(auVar112,auVar110,auVar120);
        auVar107._4_4_ = auVar99._4_4_ * auVar120._4_4_;
        auVar107._0_4_ = auVar99._0_4_ * auVar120._0_4_;
        auVar107._8_4_ = auVar99._8_4_ * auVar120._8_4_;
        auVar107._12_4_ = auVar99._12_4_ * auVar120._12_4_;
        auVar107._16_4_ = auVar99._16_4_ * auVar120._16_4_;
        auVar107._20_4_ = auVar99._20_4_ * auVar120._20_4_;
        auVar107._24_4_ = auVar99._24_4_ * auVar120._24_4_;
        auVar107._28_4_ = auVar120._28_4_;
        auVar95 = vfmsub231ps_fma(auVar107,auVar119,auVar100);
        auVar195._0_4_ = auVar119._0_4_ * auVar110._0_4_;
        auVar195._4_4_ = auVar119._4_4_ * auVar110._4_4_;
        auVar195._8_4_ = auVar119._8_4_ * auVar110._8_4_;
        auVar195._12_4_ = auVar119._12_4_ * auVar110._12_4_;
        auVar195._16_4_ = fVar202 * auVar110._16_4_;
        auVar195._20_4_ = fVar176 * auVar110._20_4_;
        auVar195._24_4_ = fVar184 * auVar110._24_4_;
        auVar195._28_4_ = 0;
        auVar93 = vfmsub231ps_fma(auVar195,auVar99,auVar118);
        auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),auVar104,auVar112);
        auVar103 = vfmadd231ps_avx512vl(auVar112,auVar104,ZEXT1632(auVar95));
        auVar112 = vmaxps_avx(auVar102,auVar103);
        uVar150 = vcmpps_avx512vl(auVar112,auVar104,2);
        bVar85 = bVar85 & (byte)uVar150;
        in_ZMM20 = ZEXT3264(local_600);
        in_ZMM21 = ZEXT3264(local_620);
        auVar229 = ZEXT3264(local_520);
        auVar227 = ZEXT3264(local_6e0);
        if (bVar85 == 0) {
          bVar85 = 0;
          auVar213 = ZEXT3264(auVar181);
          auVar183 = ZEXT3264(auVar123);
        }
        else {
          auVar37._4_4_ = auVar100._4_4_ * auVar113._4_4_;
          auVar37._0_4_ = auVar100._0_4_ * auVar113._0_4_;
          auVar37._8_4_ = auVar100._8_4_ * auVar113._8_4_;
          auVar37._12_4_ = auVar100._12_4_ * auVar113._12_4_;
          auVar37._16_4_ = auVar100._16_4_ * auVar113._16_4_;
          auVar37._20_4_ = auVar100._20_4_ * auVar113._20_4_;
          auVar37._24_4_ = auVar100._24_4_ * auVar113._24_4_;
          auVar37._28_4_ = auVar112._28_4_;
          auVar98 = vfmsub231ps_fma(auVar37,auVar99,auVar111);
          auVar38._4_4_ = auVar111._4_4_ * auVar110._4_4_;
          auVar38._0_4_ = auVar111._0_4_ * auVar110._0_4_;
          auVar38._8_4_ = auVar111._8_4_ * auVar110._8_4_;
          auVar38._12_4_ = auVar111._12_4_ * auVar110._12_4_;
          auVar38._16_4_ = auVar111._16_4_ * auVar110._16_4_;
          auVar38._20_4_ = auVar111._20_4_ * auVar110._20_4_;
          auVar38._24_4_ = auVar111._24_4_ * auVar110._24_4_;
          auVar38._28_4_ = auVar111._28_4_;
          auVar93 = vfmsub231ps_fma(auVar38,auVar101,auVar100);
          auVar39._4_4_ = auVar99._4_4_ * auVar101._4_4_;
          auVar39._0_4_ = auVar99._0_4_ * auVar101._0_4_;
          auVar39._8_4_ = auVar99._8_4_ * auVar101._8_4_;
          auVar39._12_4_ = auVar99._12_4_ * auVar101._12_4_;
          auVar39._16_4_ = auVar99._16_4_ * auVar101._16_4_;
          auVar39._20_4_ = auVar99._20_4_ * auVar101._20_4_;
          auVar39._24_4_ = auVar99._24_4_ * auVar101._24_4_;
          auVar39._28_4_ = auVar99._28_4_;
          auVar230 = vfmsub231ps_fma(auVar39,auVar110,auVar113);
          auVar95 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar93),ZEXT1632(auVar230));
          auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar95),ZEXT1632(auVar98),auVar104);
          auVar113 = vrcp14ps_avx512vl(auVar112);
          auVar28._8_4_ = 0x3f800000;
          auVar28._0_8_ = &DAT_3f8000003f800000;
          auVar28._12_4_ = 0x3f800000;
          auVar28._16_4_ = 0x3f800000;
          auVar28._20_4_ = 0x3f800000;
          auVar28._24_4_ = 0x3f800000;
          auVar28._28_4_ = 0x3f800000;
          auVar111 = vfnmadd213ps_avx512vl(auVar113,auVar112,auVar28);
          auVar95 = vfmadd132ps_fma(auVar111,auVar113,auVar113);
          auVar40._4_4_ = auVar230._4_4_ * auVar117._4_4_;
          auVar40._0_4_ = auVar230._0_4_ * auVar117._0_4_;
          auVar40._8_4_ = auVar230._8_4_ * auVar117._8_4_;
          auVar40._12_4_ = auVar230._12_4_ * auVar117._12_4_;
          auVar40._16_4_ = fVar185 * 0.0;
          auVar40._20_4_ = fVar200 * 0.0;
          auVar40._24_4_ = fVar201 * 0.0;
          auVar40._28_4_ = iVar1;
          auVar93 = vfmadd231ps_fma(auVar40,auVar108,ZEXT1632(auVar93));
          auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar109,ZEXT1632(auVar98));
          fVar185 = auVar95._0_4_;
          fVar200 = auVar95._4_4_;
          fVar201 = auVar95._8_4_;
          fVar202 = auVar95._12_4_;
          auVar113 = ZEXT1632(CONCAT412(auVar93._12_4_ * fVar202,
                                        CONCAT48(auVar93._8_4_ * fVar201,
                                                 CONCAT44(auVar93._4_4_ * fVar200,
                                                          auVar93._0_4_ * fVar185))));
          auVar215._4_4_ = uVar217;
          auVar215._0_4_ = uVar217;
          auVar215._8_4_ = uVar217;
          auVar215._12_4_ = uVar217;
          auVar215._16_4_ = uVar217;
          auVar215._20_4_ = uVar217;
          auVar215._24_4_ = uVar217;
          auVar215._28_4_ = uVar217;
          uVar150 = vcmpps_avx512vl(auVar215,auVar113,2);
          uVar149 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar29._4_4_ = uVar149;
          auVar29._0_4_ = uVar149;
          auVar29._8_4_ = uVar149;
          auVar29._12_4_ = uVar149;
          auVar29._16_4_ = uVar149;
          auVar29._20_4_ = uVar149;
          auVar29._24_4_ = uVar149;
          auVar29._28_4_ = uVar149;
          uVar21 = vcmpps_avx512vl(auVar113,auVar29,2);
          bVar85 = (byte)uVar150 & (byte)uVar21 & bVar85;
          if (bVar85 == 0) {
            bVar85 = 0;
            auVar213 = ZEXT3264(auVar181);
            auVar183 = ZEXT3264(auVar123);
          }
          else {
            uVar150 = vcmpps_avx512vl(auVar112,auVar104,4);
            if ((bVar85 & (byte)uVar150) == 0) {
              bVar85 = 0;
              auVar213 = ZEXT3264(auVar181);
              auVar183 = ZEXT3264(auVar123);
            }
            else {
              bVar85 = bVar85 & (byte)uVar150;
              fVar176 = auVar102._0_4_ * fVar185;
              fVar184 = auVar102._4_4_ * fVar200;
              auVar123._4_4_ = fVar184;
              auVar123._0_4_ = fVar176;
              fVar86 = auVar102._8_4_ * fVar201;
              auVar123._8_4_ = fVar86;
              fVar87 = auVar102._12_4_ * fVar202;
              auVar123._12_4_ = fVar87;
              fVar140 = auVar102._16_4_ * 0.0;
              auVar123._16_4_ = fVar140;
              fVar141 = auVar102._20_4_ * 0.0;
              auVar123._20_4_ = fVar141;
              fVar142 = auVar102._24_4_ * 0.0;
              auVar123._24_4_ = fVar142;
              auVar123._28_4_ = auVar102._28_4_;
              fVar185 = auVar103._0_4_ * fVar185;
              fVar200 = auVar103._4_4_ * fVar200;
              auVar181._4_4_ = fVar200;
              auVar181._0_4_ = fVar185;
              fVar201 = auVar103._8_4_ * fVar201;
              auVar181._8_4_ = fVar201;
              fVar202 = auVar103._12_4_ * fVar202;
              auVar181._12_4_ = fVar202;
              fVar143 = auVar103._16_4_ * 0.0;
              auVar181._16_4_ = fVar143;
              fVar145 = auVar103._20_4_ * 0.0;
              auVar181._20_4_ = fVar145;
              fVar146 = auVar103._24_4_ * 0.0;
              auVar181._24_4_ = fVar146;
              auVar181._28_4_ = auVar103._28_4_;
              auVar206._8_4_ = 0x3f800000;
              auVar206._0_8_ = &DAT_3f8000003f800000;
              auVar206._12_4_ = 0x3f800000;
              auVar206._16_4_ = 0x3f800000;
              auVar206._20_4_ = 0x3f800000;
              auVar206._24_4_ = 0x3f800000;
              auVar206._28_4_ = 0x3f800000;
              auVar123 = vsubps_avx(auVar206,auVar123);
              bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
              bVar13 = (bool)((byte)(uVar77 >> 2) & 1);
              bVar14 = (bool)((byte)(uVar77 >> 3) & 1);
              bVar15 = (bool)((byte)(uVar77 >> 4) & 1);
              bVar16 = (bool)((byte)(uVar77 >> 5) & 1);
              bVar17 = (bool)((byte)(uVar77 >> 6) & 1);
              bVar18 = SUB81(uVar77 >> 7,0);
              auVar213 = ZEXT3264(CONCAT428((uint)bVar18 * auVar102._28_4_ |
                                            (uint)!bVar18 * auVar123._28_4_,
                                            CONCAT424((uint)bVar17 * (int)fVar142 |
                                                      (uint)!bVar17 * auVar123._24_4_,
                                                      CONCAT420((uint)bVar16 * (int)fVar141 |
                                                                (uint)!bVar16 * auVar123._20_4_,
                                                                CONCAT416((uint)bVar15 *
                                                                          (int)fVar140 |
                                                                          (uint)!bVar15 *
                                                                          auVar123._16_4_,
                                                                          CONCAT412((uint)bVar14 *
                                                                                    (int)fVar87 |
                                                                                    (uint)!bVar14 *
                                                                                    auVar123._12_4_,
                                                                                    CONCAT48((uint)
                                                  bVar13 * (int)fVar86 |
                                                  (uint)!bVar13 * auVar123._8_4_,
                                                  CONCAT44((uint)bVar12 * (int)fVar184 |
                                                           (uint)!bVar12 * auVar123._4_4_,
                                                           (uint)(bVar76 & 1) * (int)fVar176 |
                                                           (uint)!(bool)(bVar76 & 1) *
                                                           auVar123._0_4_))))))));
              auVar123 = vsubps_avx(auVar206,auVar181);
              bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
              bVar13 = (bool)((byte)(uVar77 >> 2) & 1);
              bVar14 = (bool)((byte)(uVar77 >> 3) & 1);
              bVar15 = (bool)((byte)(uVar77 >> 4) & 1);
              bVar16 = (bool)((byte)(uVar77 >> 5) & 1);
              bVar17 = (bool)((byte)(uVar77 >> 6) & 1);
              bVar18 = SUB81(uVar77 >> 7,0);
              local_340._4_4_ = (uint)bVar12 * (int)fVar200 | (uint)!bVar12 * auVar123._4_4_;
              local_340._0_4_ =
                   (uint)(bVar76 & 1) * (int)fVar185 | (uint)!(bool)(bVar76 & 1) * auVar123._0_4_;
              local_340._8_4_ = (uint)bVar13 * (int)fVar201 | (uint)!bVar13 * auVar123._8_4_;
              local_340._12_4_ = (uint)bVar14 * (int)fVar202 | (uint)!bVar14 * auVar123._12_4_;
              local_340._16_4_ = (uint)bVar15 * (int)fVar143 | (uint)!bVar15 * auVar123._16_4_;
              local_340._20_4_ = (uint)bVar16 * (int)fVar145 | (uint)!bVar16 * auVar123._20_4_;
              local_340._24_4_ = (uint)bVar17 * (int)fVar146 | (uint)!bVar17 * auVar123._24_4_;
              local_340._28_4_ = (uint)bVar18 * auVar103._28_4_ | (uint)!bVar18 * auVar123._28_4_;
              auVar183 = ZEXT3264(auVar113);
            }
          }
        }
        auVar233 = ZEXT3264(local_660);
        auVar232 = ZEXT3264(local_640);
        if (bVar85 != 0) {
          auVar123 = vsubps_avx(ZEXT1632(auVar94),auVar105);
          auVar112 = auVar213._0_32_;
          auVar95 = vfmadd213ps_fma(auVar123,auVar112,auVar105);
          uVar149 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
          auVar105._4_4_ = uVar149;
          auVar105._0_4_ = uVar149;
          auVar105._8_4_ = uVar149;
          auVar105._12_4_ = uVar149;
          auVar105._16_4_ = uVar149;
          auVar105._20_4_ = uVar149;
          auVar105._24_4_ = uVar149;
          auVar105._28_4_ = uVar149;
          auVar123 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar95._12_4_ + auVar95._12_4_,
                                                        CONCAT48(auVar95._8_4_ + auVar95._8_4_,
                                                                 CONCAT44(auVar95._4_4_ +
                                                                          auVar95._4_4_,
                                                                          auVar95._0_4_ +
                                                                          auVar95._0_4_)))),auVar105
                                    );
          auVar181 = auVar183._0_32_;
          uVar150 = vcmpps_avx512vl(auVar181,auVar123,6);
          bVar85 = bVar85 & (byte)uVar150;
          if (bVar85 != 0) {
            auVar157._8_4_ = 0xbf800000;
            auVar157._0_8_ = 0xbf800000bf800000;
            auVar157._12_4_ = 0xbf800000;
            auVar157._16_4_ = 0xbf800000;
            auVar157._20_4_ = 0xbf800000;
            auVar157._24_4_ = 0xbf800000;
            auVar157._28_4_ = 0xbf800000;
            auVar30._8_4_ = 0x40000000;
            auVar30._0_8_ = 0x4000000040000000;
            auVar30._12_4_ = 0x40000000;
            auVar30._16_4_ = 0x40000000;
            auVar30._20_4_ = 0x40000000;
            auVar30._24_4_ = 0x40000000;
            auVar30._28_4_ = 0x40000000;
            local_4a0 = vfmadd132ps_avx512vl(local_340,auVar157,auVar30);
            local_340 = local_4a0;
            auVar123 = local_340;
            local_460 = 0;
            local_440 = local_670._0_8_;
            uStack_438 = local_670._8_8_;
            local_430 = local_680._0_8_;
            uStack_428 = local_680._8_8_;
            local_420 = local_690;
            uStack_418 = uStack_688;
            local_340 = auVar123;
            if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              fVar185 = 1.0 / auVar106._0_4_;
              local_400[0] = fVar185 * (auVar213._0_4_ + 0.0);
              local_400[1] = fVar185 * (auVar213._4_4_ + 1.0);
              local_400[2] = fVar185 * (auVar213._8_4_ + 2.0);
              local_400[3] = fVar185 * (auVar213._12_4_ + 3.0);
              fStack_3f0 = fVar185 * (auVar213._16_4_ + 4.0);
              fStack_3ec = fVar185 * (auVar213._20_4_ + 5.0);
              fStack_3e8 = fVar185 * (auVar213._24_4_ + 6.0);
              fStack_3e4 = auVar213._28_4_ + 7.0;
              local_340._0_8_ = local_4a0._0_8_;
              local_340._8_8_ = local_4a0._8_8_;
              local_340._16_8_ = local_4a0._16_8_;
              local_340._24_8_ = local_4a0._24_8_;
              local_3e0 = local_340._0_8_;
              uStack_3d8 = local_340._8_8_;
              uStack_3d0 = local_340._16_8_;
              uStack_3c8 = local_340._24_8_;
              local_3c0 = auVar181;
              auVar158._8_4_ = 0x7f800000;
              auVar158._0_8_ = 0x7f8000007f800000;
              auVar158._12_4_ = 0x7f800000;
              auVar158._16_4_ = 0x7f800000;
              auVar158._20_4_ = 0x7f800000;
              auVar158._24_4_ = 0x7f800000;
              auVar158._28_4_ = 0x7f800000;
              auVar123 = vblendmps_avx512vl(auVar158,auVar181);
              auVar124._0_4_ =
                   (uint)(bVar85 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar85 & 1) * 0x7f800000;
              bVar12 = (bool)(bVar85 >> 1 & 1);
              auVar124._4_4_ = (uint)bVar12 * auVar123._4_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar85 >> 2 & 1);
              auVar124._8_4_ = (uint)bVar12 * auVar123._8_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar85 >> 3 & 1);
              auVar124._12_4_ = (uint)bVar12 * auVar123._12_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar85 >> 4 & 1);
              auVar124._16_4_ = (uint)bVar12 * auVar123._16_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar85 >> 5 & 1);
              auVar124._20_4_ = (uint)bVar12 * auVar123._20_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar85 >> 6 & 1);
              auVar124._24_4_ = (uint)bVar12 * auVar123._24_4_ | (uint)!bVar12 * 0x7f800000;
              auVar124._28_4_ =
                   (uint)(bVar85 >> 7) * auVar123._28_4_ | (uint)!(bool)(bVar85 >> 7) * 0x7f800000;
              auVar123 = vshufps_avx(auVar124,auVar124,0xb1);
              auVar123 = vminps_avx(auVar124,auVar123);
              auVar113 = vshufpd_avx(auVar123,auVar123,5);
              auVar123 = vminps_avx(auVar123,auVar113);
              auVar113 = vpermpd_avx2(auVar123,0x4e);
              auVar123 = vminps_avx(auVar123,auVar113);
              uVar150 = vcmpps_avx512vl(auVar124,auVar123,0);
              bVar75 = (byte)uVar150 & bVar85;
              bVar76 = bVar85;
              if (bVar75 != 0) {
                bVar76 = bVar75;
              }
              uVar79 = 0;
              for (uVar78 = (uint)bVar76; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x80000000) {
                uVar79 = uVar79 + 1;
              }
              uVar77 = (ulong)uVar79;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar185 = local_400[uVar77];
                uVar149 = *(undefined4 *)((long)&local_3e0 + uVar77 * 4);
                fVar200 = 1.0 - fVar185;
                auVar23._8_4_ = 0x80000000;
                auVar23._0_8_ = 0x8000000080000000;
                auVar23._12_4_ = 0x80000000;
                auVar98 = vxorps_avx512vl(ZEXT416((uint)fVar200),auVar23);
                auVar95 = ZEXT416((uint)(fVar185 * fVar200 * 4.0));
                auVar93 = vfnmsub213ss_fma(ZEXT416((uint)fVar185),ZEXT416((uint)fVar185),auVar95);
                auVar95 = vfmadd213ss_fma(ZEXT416((uint)fVar200),ZEXT416((uint)fVar200),auVar95);
                fVar200 = fVar200 * auVar98._0_4_ * 0.5;
                fVar201 = auVar93._0_4_ * 0.5;
                fVar202 = auVar95._0_4_ * 0.5;
                fVar176 = fVar185 * fVar185 * 0.5;
                auVar213 = ZEXT3264(auVar112);
                auVar188._0_4_ = fVar176 * (float)local_690._0_4_;
                auVar188._4_4_ = fVar176 * (float)local_690._4_4_;
                auVar188._8_4_ = fVar176 * (float)uStack_688;
                auVar188._12_4_ = fVar176 * uStack_688._4_4_;
                auVar172._4_4_ = fVar202;
                auVar172._0_4_ = fVar202;
                auVar172._8_4_ = fVar202;
                auVar172._12_4_ = fVar202;
                auVar95 = vfmadd132ps_fma(auVar172,auVar188,local_680);
                auVar189._4_4_ = fVar201;
                auVar189._0_4_ = fVar201;
                auVar189._8_4_ = fVar201;
                auVar189._12_4_ = fVar201;
                auVar95 = vfmadd132ps_fma(auVar189,auVar95,local_670);
                auVar173._4_4_ = fVar200;
                auVar173._0_4_ = fVar200;
                auVar173._8_4_ = fVar200;
                auVar173._12_4_ = fVar200;
                auVar95 = vfmadd213ps_fma(auVar173,auVar92,auVar95);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3c0 + uVar77 * 4);
                auVar183 = ZEXT3264(auVar181);
                *(int *)(ray + k * 4 + 0x180) = auVar95._0_4_;
                uVar8 = vextractps_avx(auVar95,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar8;
                uVar8 = vextractps_avx(auVar95,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar8;
                *(float *)(ray + k * 4 + 0x1e0) = fVar185;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar149;
                *(undefined4 *)(ray + k * 4 + 0x220) = uVar3;
                *(uint *)(ray + k * 4 + 0x240) = uVar83;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              }
              else {
                local_380 = vpbroadcastd_avx512vl();
                local_3a0 = vpbroadcastd_avx512vl();
                local_590 = local_670._0_4_;
                uStack_58c = local_670._4_4_;
                uStack_588 = local_670._8_8_;
                local_5a0 = local_680._0_8_;
                uStack_598 = local_680._8_8_;
                local_5b0 = (float)local_690._0_4_;
                fStack_5ac = (float)local_690._4_4_;
                fStack_5a8 = (float)uStack_688;
                fStack_5a4 = uStack_688._4_4_;
                local_4c0 = auVar112;
                local_480 = auVar181;
                local_45c = iVar7;
                local_450 = auVar92;
                local_410 = bVar85;
                do {
                  auVar230 = auVar231._0_16_;
                  local_500._0_4_ = *(undefined4 *)(ray + k * 4 + 0x100);
                  fVar185 = local_400[uVar77];
                  auVar167._4_4_ = fVar185;
                  auVar167._0_4_ = fVar185;
                  auVar167._8_4_ = fVar185;
                  auVar167._12_4_ = fVar185;
                  local_260._16_4_ = fVar185;
                  local_260._0_16_ = auVar167;
                  local_260._20_4_ = fVar185;
                  local_260._24_4_ = fVar185;
                  local_260._28_4_ = fVar185;
                  local_240 = *(undefined4 *)((long)&local_3e0 + uVar77 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3c0 + uVar77 * 4);
                  local_720.context = context->user;
                  fVar200 = 1.0 - fVar185;
                  auVar27._8_4_ = 0x80000000;
                  auVar27._0_8_ = 0x8000000080000000;
                  auVar27._12_4_ = 0x80000000;
                  auVar98 = vxorps_avx512vl(ZEXT416((uint)fVar200),auVar27);
                  auVar95 = ZEXT416((uint)(fVar185 * fVar200 * 4.0));
                  auVar93 = vfnmsub213ss_fma(auVar167,auVar167,auVar95);
                  auVar95 = vfmadd213ss_fma(ZEXT416((uint)fVar200),ZEXT416((uint)fVar200),auVar95);
                  fVar200 = fVar200 * auVar98._0_4_ * 0.5;
                  fVar201 = auVar93._0_4_ * 0.5;
                  fVar202 = auVar95._0_4_ * 0.5;
                  fVar185 = fVar185 * fVar185 * 0.5;
                  auVar205._0_4_ = fVar185 * local_5b0;
                  auVar205._4_4_ = fVar185 * fStack_5ac;
                  auVar205._8_4_ = fVar185 * fStack_5a8;
                  auVar205._12_4_ = fVar185 * fStack_5a4;
                  auVar155._4_4_ = fVar202;
                  auVar155._0_4_ = fVar202;
                  auVar155._8_4_ = fVar202;
                  auVar155._12_4_ = fVar202;
                  auVar72._8_8_ = uStack_598;
                  auVar72._0_8_ = local_5a0;
                  auVar95 = vfmadd132ps_fma(auVar155,auVar205,auVar72);
                  auVar193._4_4_ = fVar201;
                  auVar193._0_4_ = fVar201;
                  auVar193._8_4_ = fVar201;
                  auVar193._12_4_ = fVar201;
                  auVar73._4_4_ = uStack_58c;
                  auVar73._0_4_ = local_590;
                  auVar73._8_8_ = uStack_588;
                  auVar95 = vfmadd132ps_fma(auVar193,auVar95,auVar73);
                  auVar156._4_4_ = fVar200;
                  auVar156._0_4_ = fVar200;
                  auVar156._8_4_ = fVar200;
                  auVar156._12_4_ = fVar200;
                  auVar95 = vfmadd213ps_fma(auVar156,auVar92,auVar95);
                  local_2c0 = auVar95._0_4_;
                  auVar199._8_4_ = 1;
                  auVar199._0_8_ = 0x100000001;
                  auVar199._12_4_ = 1;
                  auVar199._16_4_ = 1;
                  auVar199._20_4_ = 1;
                  auVar199._24_4_ = 1;
                  auVar199._28_4_ = 1;
                  local_2a0 = vpermps_avx2(auVar199,ZEXT1632(auVar95));
                  auVar209._8_4_ = 2;
                  auVar209._0_8_ = 0x200000002;
                  auVar209._12_4_ = 2;
                  auVar209._16_4_ = 2;
                  auVar209._20_4_ = 2;
                  auVar209._24_4_ = 2;
                  auVar209._28_4_ = 2;
                  local_280 = vpermps_avx2(auVar209,ZEXT1632(auVar95));
                  iStack_2bc = local_2c0;
                  iStack_2b8 = local_2c0;
                  iStack_2b4 = local_2c0;
                  iStack_2b0 = local_2c0;
                  iStack_2ac = local_2c0;
                  iStack_2a8 = local_2c0;
                  iStack_2a4 = local_2c0;
                  uStack_23c = local_240;
                  uStack_238 = local_240;
                  uStack_234 = local_240;
                  uStack_230 = local_240;
                  uStack_22c = local_240;
                  uStack_228 = local_240;
                  uStack_224 = local_240;
                  local_220 = local_3a0._0_8_;
                  uStack_218 = local_3a0._8_8_;
                  uStack_210 = local_3a0._16_8_;
                  uStack_208 = local_3a0._24_8_;
                  local_200 = local_380;
                  auVar123 = vpcmpeqd_avx2(local_380,local_380);
                  local_6e8[1] = auVar123;
                  *local_6e8 = auVar123;
                  local_1e0 = (local_720.context)->instID[0];
                  uStack_1dc = local_1e0;
                  uStack_1d8 = local_1e0;
                  uStack_1d4 = local_1e0;
                  uStack_1d0 = local_1e0;
                  uStack_1cc = local_1e0;
                  uStack_1c8 = local_1e0;
                  uStack_1c4 = local_1e0;
                  local_1c0 = (local_720.context)->instPrimID[0];
                  uStack_1bc = local_1c0;
                  uStack_1b8 = local_1c0;
                  uStack_1b4 = local_1c0;
                  uStack_1b0 = local_1c0;
                  uStack_1ac = local_1c0;
                  uStack_1a8 = local_1c0;
                  uStack_1a4 = local_1c0;
                  local_5e0 = local_2e0._0_8_;
                  uStack_5d8 = local_2e0._8_8_;
                  uStack_5d0 = local_2e0._16_8_;
                  uStack_5c8 = local_2e0._24_8_;
                  local_720.valid = (int *)&local_5e0;
                  local_720.geometryUserPtr = *(void **)(CONCAT44(uStack_55c,local_560) + 0x18);
                  local_720.hit = (RTCHitN *)&local_2c0;
                  local_720.N = 8;
                  pcVar11 = *(code **)(CONCAT44(uStack_55c,local_560) + 0x40);
                  local_540._0_8_ = uVar77;
                  local_720.ray = (RTCRayN *)ray;
                  if (pcVar11 != (code *)0x0) {
                    (*pcVar11)(&local_720);
                    auVar233 = ZEXT3264(local_660);
                    auVar232 = ZEXT3264(local_640);
                    auVar227 = ZEXT3264(local_6e0);
                    auVar228 = ZEXT3264(local_6c0);
                    auVar229 = ZEXT3264(local_520);
                    in_ZMM21 = ZEXT3264(local_620);
                    in_ZMM20 = ZEXT3264(local_600);
                    auVar95 = vxorps_avx512vl(auVar230,auVar230);
                    auVar231 = ZEXT1664(auVar95);
                    uVar77 = local_540._0_8_;
                    uVar217 = local_580._0_4_;
                  }
                  auVar95 = auVar231._0_16_;
                  auVar68._8_8_ = uStack_5d8;
                  auVar68._0_8_ = local_5e0;
                  auVar68._16_8_ = uStack_5d0;
                  auVar68._24_8_ = uStack_5c8;
                  if (auVar68 == (undefined1  [32])0x0) {
LAB_01afa7e7:
                    *(undefined4 *)(ray + k * 4 + 0x100) = local_500._0_4_;
                  }
                  else {
                    p_Var10 = context->args->filter;
                    if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)(CONCAT44(uStack_55c,local_560) + 0x3e) & 0x40) != 0)))) {
                      (*p_Var10)(&local_720);
                      auVar233 = ZEXT3264(local_660);
                      auVar232 = ZEXT3264(local_640);
                      auVar227 = ZEXT3264(local_6e0);
                      auVar228 = ZEXT3264(local_6c0);
                      auVar229 = ZEXT3264(local_520);
                      in_ZMM21 = ZEXT3264(local_620);
                      in_ZMM20 = ZEXT3264(local_600);
                      auVar95 = vxorps_avx512vl(auVar95,auVar95);
                      auVar231 = ZEXT1664(auVar95);
                      uVar77 = local_540._0_8_;
                      uVar217 = local_580._0_4_;
                    }
                    auVar69._8_8_ = uStack_5d8;
                    auVar69._0_8_ = local_5e0;
                    auVar69._16_8_ = uStack_5d0;
                    auVar69._24_8_ = uStack_5c8;
                    if (auVar69 == (undefined1  [32])0x0) goto LAB_01afa7e7;
                    uVar81 = vptestmd_avx512vl(auVar69,auVar69);
                    iVar1 = *(int *)(local_720.hit + 4);
                    iVar2 = *(int *)(local_720.hit + 8);
                    iVar61 = *(int *)(local_720.hit + 0xc);
                    iVar62 = *(int *)(local_720.hit + 0x10);
                    iVar63 = *(int *)(local_720.hit + 0x14);
                    iVar64 = *(int *)(local_720.hit + 0x18);
                    iVar65 = *(int *)(local_720.hit + 0x1c);
                    bVar76 = (byte)uVar81;
                    bVar12 = (bool)((byte)(uVar81 >> 1) & 1);
                    bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
                    bVar14 = (bool)((byte)(uVar81 >> 3) & 1);
                    bVar15 = (bool)((byte)(uVar81 >> 4) & 1);
                    bVar16 = (bool)((byte)(uVar81 >> 5) & 1);
                    bVar17 = (bool)((byte)(uVar81 >> 6) & 1);
                    bVar18 = SUB81(uVar81 >> 7,0);
                    *(uint *)(local_720.ray + 0x180) =
                         (uint)(bVar76 & 1) * *(int *)local_720.hit |
                         (uint)!(bool)(bVar76 & 1) * *(int *)(local_720.ray + 0x180);
                    *(uint *)(local_720.ray + 0x184) =
                         (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_720.ray + 0x184);
                    *(uint *)(local_720.ray + 0x188) =
                         (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_720.ray + 0x188);
                    *(uint *)(local_720.ray + 0x18c) =
                         (uint)bVar14 * iVar61 | (uint)!bVar14 * *(int *)(local_720.ray + 0x18c);
                    *(uint *)(local_720.ray + 400) =
                         (uint)bVar15 * iVar62 | (uint)!bVar15 * *(int *)(local_720.ray + 400);
                    *(uint *)(local_720.ray + 0x194) =
                         (uint)bVar16 * iVar63 | (uint)!bVar16 * *(int *)(local_720.ray + 0x194);
                    *(uint *)(local_720.ray + 0x198) =
                         (uint)bVar17 * iVar64 | (uint)!bVar17 * *(int *)(local_720.ray + 0x198);
                    *(uint *)(local_720.ray + 0x19c) =
                         (uint)bVar18 * iVar65 | (uint)!bVar18 * *(int *)(local_720.ray + 0x19c);
                    iVar1 = *(int *)(local_720.hit + 0x24);
                    iVar2 = *(int *)(local_720.hit + 0x28);
                    iVar61 = *(int *)(local_720.hit + 0x2c);
                    iVar62 = *(int *)(local_720.hit + 0x30);
                    iVar63 = *(int *)(local_720.hit + 0x34);
                    iVar64 = *(int *)(local_720.hit + 0x38);
                    iVar65 = *(int *)(local_720.hit + 0x3c);
                    bVar12 = (bool)((byte)(uVar81 >> 1) & 1);
                    bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
                    bVar14 = (bool)((byte)(uVar81 >> 3) & 1);
                    bVar15 = (bool)((byte)(uVar81 >> 4) & 1);
                    bVar16 = (bool)((byte)(uVar81 >> 5) & 1);
                    bVar17 = (bool)((byte)(uVar81 >> 6) & 1);
                    bVar18 = SUB81(uVar81 >> 7,0);
                    *(uint *)(local_720.ray + 0x1a0) =
                         (uint)(bVar76 & 1) * *(int *)(local_720.hit + 0x20) |
                         (uint)!(bool)(bVar76 & 1) * *(int *)(local_720.ray + 0x1a0);
                    *(uint *)(local_720.ray + 0x1a4) =
                         (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_720.ray + 0x1a4);
                    *(uint *)(local_720.ray + 0x1a8) =
                         (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_720.ray + 0x1a8);
                    *(uint *)(local_720.ray + 0x1ac) =
                         (uint)bVar14 * iVar61 | (uint)!bVar14 * *(int *)(local_720.ray + 0x1ac);
                    *(uint *)(local_720.ray + 0x1b0) =
                         (uint)bVar15 * iVar62 | (uint)!bVar15 * *(int *)(local_720.ray + 0x1b0);
                    *(uint *)(local_720.ray + 0x1b4) =
                         (uint)bVar16 * iVar63 | (uint)!bVar16 * *(int *)(local_720.ray + 0x1b4);
                    *(uint *)(local_720.ray + 0x1b8) =
                         (uint)bVar17 * iVar64 | (uint)!bVar17 * *(int *)(local_720.ray + 0x1b8);
                    *(uint *)(local_720.ray + 0x1bc) =
                         (uint)bVar18 * iVar65 | (uint)!bVar18 * *(int *)(local_720.ray + 0x1bc);
                    iVar1 = *(int *)(local_720.hit + 0x44);
                    iVar2 = *(int *)(local_720.hit + 0x48);
                    iVar61 = *(int *)(local_720.hit + 0x4c);
                    iVar62 = *(int *)(local_720.hit + 0x50);
                    iVar63 = *(int *)(local_720.hit + 0x54);
                    iVar64 = *(int *)(local_720.hit + 0x58);
                    iVar65 = *(int *)(local_720.hit + 0x5c);
                    bVar12 = (bool)((byte)(uVar81 >> 1) & 1);
                    bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
                    bVar14 = (bool)((byte)(uVar81 >> 3) & 1);
                    bVar15 = (bool)((byte)(uVar81 >> 4) & 1);
                    bVar16 = (bool)((byte)(uVar81 >> 5) & 1);
                    bVar17 = (bool)((byte)(uVar81 >> 6) & 1);
                    bVar18 = SUB81(uVar81 >> 7,0);
                    *(uint *)(local_720.ray + 0x1c0) =
                         (uint)(bVar76 & 1) * *(int *)(local_720.hit + 0x40) |
                         (uint)!(bool)(bVar76 & 1) * *(int *)(local_720.ray + 0x1c0);
                    *(uint *)(local_720.ray + 0x1c4) =
                         (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_720.ray + 0x1c4);
                    *(uint *)(local_720.ray + 0x1c8) =
                         (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_720.ray + 0x1c8);
                    *(uint *)(local_720.ray + 0x1cc) =
                         (uint)bVar14 * iVar61 | (uint)!bVar14 * *(int *)(local_720.ray + 0x1cc);
                    *(uint *)(local_720.ray + 0x1d0) =
                         (uint)bVar15 * iVar62 | (uint)!bVar15 * *(int *)(local_720.ray + 0x1d0);
                    *(uint *)(local_720.ray + 0x1d4) =
                         (uint)bVar16 * iVar63 | (uint)!bVar16 * *(int *)(local_720.ray + 0x1d4);
                    *(uint *)(local_720.ray + 0x1d8) =
                         (uint)bVar17 * iVar64 | (uint)!bVar17 * *(int *)(local_720.ray + 0x1d8);
                    *(uint *)(local_720.ray + 0x1dc) =
                         (uint)bVar18 * iVar65 | (uint)!bVar18 * *(int *)(local_720.ray + 0x1dc);
                    iVar1 = *(int *)(local_720.hit + 100);
                    iVar2 = *(int *)(local_720.hit + 0x68);
                    iVar61 = *(int *)(local_720.hit + 0x6c);
                    iVar62 = *(int *)(local_720.hit + 0x70);
                    iVar63 = *(int *)(local_720.hit + 0x74);
                    iVar64 = *(int *)(local_720.hit + 0x78);
                    iVar65 = *(int *)(local_720.hit + 0x7c);
                    bVar12 = (bool)((byte)(uVar81 >> 1) & 1);
                    bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
                    bVar14 = (bool)((byte)(uVar81 >> 3) & 1);
                    bVar15 = (bool)((byte)(uVar81 >> 4) & 1);
                    bVar16 = (bool)((byte)(uVar81 >> 5) & 1);
                    bVar17 = (bool)((byte)(uVar81 >> 6) & 1);
                    bVar18 = SUB81(uVar81 >> 7,0);
                    *(uint *)(local_720.ray + 0x1e0) =
                         (uint)(bVar76 & 1) * *(int *)(local_720.hit + 0x60) |
                         (uint)!(bool)(bVar76 & 1) * *(int *)(local_720.ray + 0x1e0);
                    *(uint *)(local_720.ray + 0x1e4) =
                         (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_720.ray + 0x1e4);
                    *(uint *)(local_720.ray + 0x1e8) =
                         (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_720.ray + 0x1e8);
                    *(uint *)(local_720.ray + 0x1ec) =
                         (uint)bVar14 * iVar61 | (uint)!bVar14 * *(int *)(local_720.ray + 0x1ec);
                    *(uint *)(local_720.ray + 0x1f0) =
                         (uint)bVar15 * iVar62 | (uint)!bVar15 * *(int *)(local_720.ray + 0x1f0);
                    *(uint *)(local_720.ray + 500) =
                         (uint)bVar16 * iVar63 | (uint)!bVar16 * *(int *)(local_720.ray + 500);
                    *(uint *)(local_720.ray + 0x1f8) =
                         (uint)bVar17 * iVar64 | (uint)!bVar17 * *(int *)(local_720.ray + 0x1f8);
                    *(uint *)(local_720.ray + 0x1fc) =
                         (uint)bVar18 * iVar65 | (uint)!bVar18 * *(int *)(local_720.ray + 0x1fc);
                    auVar138._0_4_ =
                         (uint)(bVar76 & 1) * *(int *)(local_720.hit + 0x80) |
                         (uint)!(bool)(bVar76 & 1) * *(int *)(local_720.ray + 0x200);
                    bVar12 = (bool)((byte)(uVar81 >> 1) & 1);
                    auVar138._4_4_ =
                         (uint)bVar12 * *(int *)(local_720.hit + 0x84) |
                         (uint)!bVar12 * *(int *)(local_720.ray + 0x204);
                    bVar12 = (bool)((byte)(uVar81 >> 2) & 1);
                    auVar138._8_4_ =
                         (uint)bVar12 * *(int *)(local_720.hit + 0x88) |
                         (uint)!bVar12 * *(int *)(local_720.ray + 0x208);
                    bVar12 = (bool)((byte)(uVar81 >> 3) & 1);
                    auVar138._12_4_ =
                         (uint)bVar12 * *(int *)(local_720.hit + 0x8c) |
                         (uint)!bVar12 * *(int *)(local_720.ray + 0x20c);
                    bVar12 = (bool)((byte)(uVar81 >> 4) & 1);
                    auVar138._16_4_ =
                         (uint)bVar12 * *(int *)(local_720.hit + 0x90) |
                         (uint)!bVar12 * *(int *)(local_720.ray + 0x210);
                    bVar12 = (bool)((byte)(uVar81 >> 5) & 1);
                    auVar138._20_4_ =
                         (uint)bVar12 * *(int *)(local_720.hit + 0x94) |
                         (uint)!bVar12 * *(int *)(local_720.ray + 0x214);
                    bVar12 = (bool)((byte)(uVar81 >> 6) & 1);
                    auVar138._24_4_ =
                         (uint)bVar12 * *(int *)(local_720.hit + 0x98) |
                         (uint)!bVar12 * *(int *)(local_720.ray + 0x218);
                    bVar12 = SUB81(uVar81 >> 7,0);
                    auVar138._28_4_ =
                         (uint)bVar12 * *(int *)(local_720.hit + 0x9c) |
                         (uint)!bVar12 * *(int *)(local_720.ray + 0x21c);
                    *(undefined1 (*) [32])(local_720.ray + 0x200) = auVar138;
                    auVar123 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_720.hit + 0xa0));
                    *(undefined1 (*) [32])(local_720.ray + 0x220) = auVar123;
                    auVar123 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_720.hit + 0xc0));
                    *(undefined1 (*) [32])(local_720.ray + 0x240) = auVar123;
                    auVar123 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_720.hit + 0xe0));
                    *(undefined1 (*) [32])(local_720.ray + 0x260) = auVar123;
                    auVar123 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_720.hit + 0x100));
                    *(undefined1 (*) [32])(local_720.ray + 0x280) = auVar123;
                  }
                  auVar213 = ZEXT3264(auVar112);
                  auVar183 = ZEXT3264(auVar181);
                  bVar76 = ~(byte)(1 << ((uint)uVar77 & 0x1f)) & bVar85;
                  uVar149 = *(undefined4 *)(ray + k * 4 + 0x100);
                  auVar36._4_4_ = uVar149;
                  auVar36._0_4_ = uVar149;
                  auVar36._8_4_ = uVar149;
                  auVar36._12_4_ = uVar149;
                  auVar36._16_4_ = uVar149;
                  auVar36._20_4_ = uVar149;
                  auVar36._24_4_ = uVar149;
                  auVar36._28_4_ = uVar149;
                  uVar150 = vcmpps_avx512vl(auVar181,auVar36,2);
                  bVar85 = bVar76 & (byte)uVar150;
                  if ((bVar76 & (byte)uVar150) != 0) {
                    auVar163._8_4_ = 0x7f800000;
                    auVar163._0_8_ = 0x7f8000007f800000;
                    auVar163._12_4_ = 0x7f800000;
                    auVar163._16_4_ = 0x7f800000;
                    auVar163._20_4_ = 0x7f800000;
                    auVar163._24_4_ = 0x7f800000;
                    auVar163._28_4_ = 0x7f800000;
                    auVar123 = vblendmps_avx512vl(auVar163,auVar181);
                    auVar139._0_4_ =
                         (uint)(bVar85 & 1) * auVar123._0_4_ |
                         (uint)!(bool)(bVar85 & 1) * 0x7f800000;
                    bVar12 = (bool)(bVar85 >> 1 & 1);
                    auVar139._4_4_ = (uint)bVar12 * auVar123._4_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar85 >> 2 & 1);
                    auVar139._8_4_ = (uint)bVar12 * auVar123._8_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar85 >> 3 & 1);
                    auVar139._12_4_ = (uint)bVar12 * auVar123._12_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar85 >> 4 & 1);
                    auVar139._16_4_ = (uint)bVar12 * auVar123._16_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar85 >> 5 & 1);
                    auVar139._20_4_ = (uint)bVar12 * auVar123._20_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar85 >> 6 & 1);
                    auVar139._24_4_ = (uint)bVar12 * auVar123._24_4_ | (uint)!bVar12 * 0x7f800000;
                    auVar139._28_4_ =
                         (uint)(bVar85 >> 7) * auVar123._28_4_ |
                         (uint)!(bool)(bVar85 >> 7) * 0x7f800000;
                    auVar123 = vshufps_avx(auVar139,auVar139,0xb1);
                    auVar123 = vminps_avx(auVar139,auVar123);
                    auVar113 = vshufpd_avx(auVar123,auVar123,5);
                    auVar123 = vminps_avx(auVar123,auVar113);
                    auVar113 = vpermpd_avx2(auVar123,0x4e);
                    auVar123 = vminps_avx(auVar123,auVar113);
                    uVar150 = vcmpps_avx512vl(auVar139,auVar123,0);
                    bVar75 = (byte)uVar150 & bVar85;
                    bVar76 = bVar85;
                    if (bVar75 != 0) {
                      bVar76 = bVar75;
                    }
                    uVar79 = 0;
                    for (uVar78 = (uint)bVar76; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x80000000
                        ) {
                      uVar79 = uVar79 + 1;
                    }
                    uVar77 = (ulong)uVar79;
                  }
                } while (bVar85 != 0);
              }
            }
          }
        }
      }
      if (8 < iVar7) {
        local_540 = vpbroadcastd_avx512vl();
        local_500 = vbroadcastss_avx512vl(auVar90);
        fStack_570 = 1.0 / (float)local_4e0._0_4_;
        local_580._4_4_ = fStack_570;
        local_580._0_4_ = fStack_570;
        fStack_578 = fStack_570;
        fStack_574 = fStack_570;
        local_4e0 = vpbroadcastd_avx512vl();
        local_380 = vpbroadcastd_avx512vl();
        lVar82 = 8;
        auVar181 = auVar213._0_32_;
        auVar123 = auVar183._0_32_;
        fStack_56c = fStack_570;
        fStack_568 = fStack_570;
        fStack_564 = fStack_570;
        local_560 = uVar217;
        uStack_55c = uVar217;
        uStack_558 = uVar217;
        uStack_554 = uVar217;
        uStack_550 = uVar217;
        uStack_54c = uVar217;
        uStack_548 = uVar217;
        uStack_544 = uVar217;
        do {
          auVar112 = vpbroadcastd_avx512vl();
          auVar99 = vpor_avx2(auVar112,_DAT_0205a920);
          uVar21 = vpcmpd_avx512vl(auVar99,local_540,1);
          auVar112 = *(undefined1 (*) [32])(bspline_basis0 + lVar82 * 4 + lVar22);
          auVar113 = *(undefined1 (*) [32])(lVar22 + 0x222bfac + lVar82 * 4);
          auVar111 = *(undefined1 (*) [32])(lVar22 + 0x222c430 + lVar82 * 4);
          auVar110 = *(undefined1 (*) [32])(lVar22 + 0x222c8b4 + lVar82 * 4);
          local_640 = auVar232._0_32_;
          auVar100 = vmulps_avx512vl(local_640,auVar110);
          local_660 = auVar233._0_32_;
          auVar109 = vmulps_avx512vl(local_660,auVar110);
          auVar41._4_4_ = auVar110._4_4_ * (float)local_120._4_4_;
          auVar41._0_4_ = auVar110._0_4_ * (float)local_120._0_4_;
          auVar41._8_4_ = auVar110._8_4_ * fStack_118;
          auVar41._12_4_ = auVar110._12_4_ * fStack_114;
          auVar41._16_4_ = auVar110._16_4_ * fStack_110;
          auVar41._20_4_ = auVar110._20_4_ * fStack_10c;
          auVar41._24_4_ = auVar110._24_4_ * fStack_108;
          auVar41._28_4_ = auVar99._28_4_;
          auVar99 = vfmadd231ps_avx512vl(auVar100,auVar111,local_80);
          auVar100 = vfmadd231ps_avx512vl(auVar109,auVar111,local_a0);
          auVar109 = vfmadd231ps_avx512vl(auVar41,auVar111,local_100);
          auVar115 = auVar227._0_32_;
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar113,auVar115);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar113,local_320);
          auVar90 = vfmadd231ps_fma(auVar109,auVar113,local_e0);
          auVar117 = auVar229._0_32_;
          auVar103 = vfmadd231ps_avx512vl(auVar99,auVar112,auVar117);
          auVar116 = auVar228._0_32_;
          auVar104 = vfmadd231ps_avx512vl(auVar100,auVar112,auVar116);
          auVar99 = *(undefined1 (*) [32])(bspline_basis1 + lVar82 * 4 + lVar22);
          auVar100 = *(undefined1 (*) [32])(lVar22 + 0x222e3cc + lVar82 * 4);
          auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar112,local_c0);
          auVar109 = *(undefined1 (*) [32])(lVar22 + 0x222e850 + lVar82 * 4);
          auVar108 = *(undefined1 (*) [32])(lVar22 + 0x222ecd4 + lVar82 * 4);
          auVar101 = vmulps_avx512vl(local_640,auVar108);
          auVar102 = vmulps_avx512vl(local_660,auVar108);
          auVar42._4_4_ = auVar108._4_4_ * (float)local_120._4_4_;
          auVar42._0_4_ = auVar108._0_4_ * (float)local_120._0_4_;
          auVar42._8_4_ = auVar108._8_4_ * fStack_118;
          auVar42._12_4_ = auVar108._12_4_ * fStack_114;
          auVar42._16_4_ = auVar108._16_4_ * fStack_110;
          auVar42._20_4_ = auVar108._20_4_ * fStack_10c;
          auVar42._24_4_ = auVar108._24_4_ * fStack_108;
          auVar42._28_4_ = uStack_104;
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar109,local_80);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar109,local_a0);
          auVar105 = vfmadd231ps_avx512vl(auVar42,auVar109,local_100);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar100,auVar115);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar100,local_320);
          auVar95 = vfmadd231ps_fma(auVar105,auVar100,local_e0);
          auVar105 = vfmadd231ps_avx512vl(auVar101,auVar99,auVar117);
          auVar106 = vfmadd231ps_avx512vl(auVar102,auVar99,auVar116);
          auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar99,local_c0);
          auVar107 = vmaxps_avx512vl(ZEXT1632(auVar90),ZEXT1632(auVar95));
          auVar101 = vsubps_avx(auVar105,auVar103);
          auVar102 = vsubps_avx(auVar106,auVar104);
          auVar114 = vmulps_avx512vl(auVar104,auVar101);
          auVar125 = vmulps_avx512vl(auVar103,auVar102);
          auVar114 = vsubps_avx512vl(auVar114,auVar125);
          auVar125 = vmulps_avx512vl(auVar102,auVar102);
          auVar125 = vfmadd231ps_avx512vl(auVar125,auVar101,auVar101);
          auVar107 = vmulps_avx512vl(auVar107,auVar107);
          auVar107 = vmulps_avx512vl(auVar107,auVar125);
          auVar114 = vmulps_avx512vl(auVar114,auVar114);
          uVar150 = vcmpps_avx512vl(auVar114,auVar107,2);
          local_410 = (byte)uVar21 & (byte)uVar150;
          if (local_410 == 0) {
            auVar228 = ZEXT3264(auVar116);
            auVar227 = ZEXT3264(auVar115);
          }
          else {
            auVar108 = vmulps_avx512vl(local_1a0,auVar108);
            auVar109 = vfmadd213ps_avx512vl(auVar109,local_180,auVar108);
            auVar100 = vfmadd213ps_avx512vl(auVar100,local_160,auVar109);
            auVar99 = vfmadd213ps_avx512vl(auVar99,local_140,auVar100);
            auVar110 = vmulps_avx512vl(local_1a0,auVar110);
            auVar111 = vfmadd213ps_avx512vl(auVar111,local_180,auVar110);
            auVar113 = vfmadd213ps_avx512vl(auVar113,local_160,auVar111);
            auVar100 = vfmadd213ps_avx512vl(auVar112,local_140,auVar113);
            auVar112 = *(undefined1 (*) [32])(lVar22 + 0x222cd38 + lVar82 * 4);
            auVar113 = *(undefined1 (*) [32])(lVar22 + 0x222d1bc + lVar82 * 4);
            auVar111 = *(undefined1 (*) [32])(lVar22 + 0x222d640 + lVar82 * 4);
            auVar110 = *(undefined1 (*) [32])(lVar22 + 0x222dac4 + lVar82 * 4);
            auVar109 = vmulps_avx512vl(local_640,auVar110);
            auVar108 = vmulps_avx512vl(local_660,auVar110);
            auVar110 = vmulps_avx512vl(local_1a0,auVar110);
            auVar109 = vfmadd231ps_avx512vl(auVar109,auVar111,local_80);
            auVar108 = vfmadd231ps_avx512vl(auVar108,auVar111,local_a0);
            auVar111 = vfmadd231ps_avx512vl(auVar110,local_180,auVar111);
            auVar110 = vfmadd231ps_avx512vl(auVar109,auVar113,auVar115);
            auVar109 = vfmadd231ps_avx512vl(auVar108,auVar113,local_320);
            auVar113 = vfmadd231ps_avx512vl(auVar111,local_160,auVar113);
            auVar110 = vfmadd231ps_avx512vl(auVar110,auVar112,auVar117);
            auVar109 = vfmadd231ps_avx512vl(auVar109,auVar112,auVar116);
            auVar108 = vfmadd231ps_avx512vl(auVar113,local_140,auVar112);
            auVar112 = *(undefined1 (*) [32])(lVar22 + 0x222f158 + lVar82 * 4);
            auVar113 = *(undefined1 (*) [32])(lVar22 + 0x222fa60 + lVar82 * 4);
            auVar111 = *(undefined1 (*) [32])(lVar22 + 0x222fee4 + lVar82 * 4);
            auVar107 = vmulps_avx512vl(local_640,auVar111);
            auVar114 = vmulps_avx512vl(local_660,auVar111);
            auVar111 = vmulps_avx512vl(local_1a0,auVar111);
            auVar107 = vfmadd231ps_avx512vl(auVar107,auVar113,local_80);
            auVar114 = vfmadd231ps_avx512vl(auVar114,auVar113,local_a0);
            auVar111 = vfmadd231ps_avx512vl(auVar111,local_180,auVar113);
            auVar113 = *(undefined1 (*) [32])(lVar22 + 0x222f5dc + lVar82 * 4);
            auVar107 = vfmadd231ps_avx512vl(auVar107,auVar113,auVar115);
            auVar93 = vfmadd231ps_fma(auVar114,auVar113,local_320);
            auVar113 = vfmadd231ps_avx512vl(auVar111,local_160,auVar113);
            auVar111 = vfmadd231ps_avx512vl(auVar107,auVar112,auVar117);
            auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),auVar112,auVar116);
            auVar113 = vfmadd231ps_avx512vl(auVar113,local_140,auVar112);
            auVar114 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar110,auVar114);
            vandps_avx512vl(auVar109,auVar114);
            auVar112 = vmaxps_avx(auVar114,auVar114);
            vandps_avx512vl(auVar108,auVar114);
            auVar112 = vmaxps_avx(auVar112,auVar114);
            uVar77 = vcmpps_avx512vl(auVar112,local_500,1);
            bVar12 = (bool)((byte)uVar77 & 1);
            auVar126._0_4_ = (float)((uint)bVar12 * auVar101._0_4_ | (uint)!bVar12 * auVar110._0_4_)
            ;
            bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
            auVar126._4_4_ = (float)((uint)bVar12 * auVar101._4_4_ | (uint)!bVar12 * auVar110._4_4_)
            ;
            bVar12 = (bool)((byte)(uVar77 >> 2) & 1);
            auVar126._8_4_ = (float)((uint)bVar12 * auVar101._8_4_ | (uint)!bVar12 * auVar110._8_4_)
            ;
            bVar12 = (bool)((byte)(uVar77 >> 3) & 1);
            auVar126._12_4_ =
                 (float)((uint)bVar12 * auVar101._12_4_ | (uint)!bVar12 * auVar110._12_4_);
            bVar12 = (bool)((byte)(uVar77 >> 4) & 1);
            auVar126._16_4_ =
                 (float)((uint)bVar12 * auVar101._16_4_ | (uint)!bVar12 * auVar110._16_4_);
            bVar12 = (bool)((byte)(uVar77 >> 5) & 1);
            auVar126._20_4_ =
                 (float)((uint)bVar12 * auVar101._20_4_ | (uint)!bVar12 * auVar110._20_4_);
            bVar12 = (bool)((byte)(uVar77 >> 6) & 1);
            auVar126._24_4_ =
                 (float)((uint)bVar12 * auVar101._24_4_ | (uint)!bVar12 * auVar110._24_4_);
            bVar12 = SUB81(uVar77 >> 7,0);
            auVar126._28_4_ = (uint)bVar12 * auVar101._28_4_ | (uint)!bVar12 * auVar110._28_4_;
            bVar12 = (bool)((byte)uVar77 & 1);
            auVar127._0_4_ = (float)((uint)bVar12 * auVar102._0_4_ | (uint)!bVar12 * auVar109._0_4_)
            ;
            bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
            auVar127._4_4_ = (float)((uint)bVar12 * auVar102._4_4_ | (uint)!bVar12 * auVar109._4_4_)
            ;
            bVar12 = (bool)((byte)(uVar77 >> 2) & 1);
            auVar127._8_4_ = (float)((uint)bVar12 * auVar102._8_4_ | (uint)!bVar12 * auVar109._8_4_)
            ;
            bVar12 = (bool)((byte)(uVar77 >> 3) & 1);
            auVar127._12_4_ =
                 (float)((uint)bVar12 * auVar102._12_4_ | (uint)!bVar12 * auVar109._12_4_);
            bVar12 = (bool)((byte)(uVar77 >> 4) & 1);
            auVar127._16_4_ =
                 (float)((uint)bVar12 * auVar102._16_4_ | (uint)!bVar12 * auVar109._16_4_);
            bVar12 = (bool)((byte)(uVar77 >> 5) & 1);
            auVar127._20_4_ =
                 (float)((uint)bVar12 * auVar102._20_4_ | (uint)!bVar12 * auVar109._20_4_);
            bVar12 = (bool)((byte)(uVar77 >> 6) & 1);
            auVar127._24_4_ =
                 (float)((uint)bVar12 * auVar102._24_4_ | (uint)!bVar12 * auVar109._24_4_);
            bVar12 = SUB81(uVar77 >> 7,0);
            auVar127._28_4_ = (uint)bVar12 * auVar102._28_4_ | (uint)!bVar12 * auVar109._28_4_;
            vandps_avx512vl(auVar111,auVar114);
            vandps_avx512vl(auVar107,auVar114);
            auVar112 = vmaxps_avx(auVar127,auVar127);
            vandps_avx512vl(auVar113,auVar114);
            auVar112 = vmaxps_avx(auVar112,auVar127);
            uVar77 = vcmpps_avx512vl(auVar112,local_500,1);
            bVar12 = (bool)((byte)uVar77 & 1);
            auVar128._0_4_ = (uint)bVar12 * auVar101._0_4_ | (uint)!bVar12 * auVar111._0_4_;
            bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
            auVar128._4_4_ = (uint)bVar12 * auVar101._4_4_ | (uint)!bVar12 * auVar111._4_4_;
            bVar12 = (bool)((byte)(uVar77 >> 2) & 1);
            auVar128._8_4_ = (uint)bVar12 * auVar101._8_4_ | (uint)!bVar12 * auVar111._8_4_;
            bVar12 = (bool)((byte)(uVar77 >> 3) & 1);
            auVar128._12_4_ = (uint)bVar12 * auVar101._12_4_ | (uint)!bVar12 * auVar111._12_4_;
            bVar12 = (bool)((byte)(uVar77 >> 4) & 1);
            auVar128._16_4_ = (uint)bVar12 * auVar101._16_4_ | (uint)!bVar12 * auVar111._16_4_;
            bVar12 = (bool)((byte)(uVar77 >> 5) & 1);
            auVar128._20_4_ = (uint)bVar12 * auVar101._20_4_ | (uint)!bVar12 * auVar111._20_4_;
            bVar12 = (bool)((byte)(uVar77 >> 6) & 1);
            auVar128._24_4_ = (uint)bVar12 * auVar101._24_4_ | (uint)!bVar12 * auVar111._24_4_;
            bVar12 = SUB81(uVar77 >> 7,0);
            auVar128._28_4_ = (uint)bVar12 * auVar101._28_4_ | (uint)!bVar12 * auVar111._28_4_;
            bVar12 = (bool)((byte)uVar77 & 1);
            auVar129._0_4_ = (float)((uint)bVar12 * auVar102._0_4_ | (uint)!bVar12 * auVar107._0_4_)
            ;
            bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
            auVar129._4_4_ = (float)((uint)bVar12 * auVar102._4_4_ | (uint)!bVar12 * auVar107._4_4_)
            ;
            bVar12 = (bool)((byte)(uVar77 >> 2) & 1);
            auVar129._8_4_ = (float)((uint)bVar12 * auVar102._8_4_ | (uint)!bVar12 * auVar107._8_4_)
            ;
            bVar12 = (bool)((byte)(uVar77 >> 3) & 1);
            auVar129._12_4_ =
                 (float)((uint)bVar12 * auVar102._12_4_ | (uint)!bVar12 * auVar107._12_4_);
            bVar12 = (bool)((byte)(uVar77 >> 4) & 1);
            auVar129._16_4_ =
                 (float)((uint)bVar12 * auVar102._16_4_ | (uint)!bVar12 * auVar107._16_4_);
            bVar12 = (bool)((byte)(uVar77 >> 5) & 1);
            auVar129._20_4_ =
                 (float)((uint)bVar12 * auVar102._20_4_ | (uint)!bVar12 * auVar107._20_4_);
            bVar12 = (bool)((byte)(uVar77 >> 6) & 1);
            auVar129._24_4_ =
                 (float)((uint)bVar12 * auVar102._24_4_ | (uint)!bVar12 * auVar107._24_4_);
            bVar12 = SUB81(uVar77 >> 7,0);
            auVar129._28_4_ = (uint)bVar12 * auVar102._28_4_ | (uint)!bVar12 * auVar107._28_4_;
            auVar219._8_4_ = 0x80000000;
            auVar219._0_8_ = 0x8000000080000000;
            auVar219._12_4_ = 0x80000000;
            auVar219._16_4_ = 0x80000000;
            auVar219._20_4_ = 0x80000000;
            auVar219._24_4_ = 0x80000000;
            auVar219._28_4_ = 0x80000000;
            auVar112 = vxorps_avx512vl(auVar128,auVar219);
            auVar107 = auVar231._0_32_;
            auVar113 = vfmadd213ps_avx512vl(auVar126,auVar126,auVar107);
            auVar93 = vfmadd231ps_fma(auVar113,auVar127,auVar127);
            auVar113 = vrsqrt14ps_avx512vl(ZEXT1632(auVar93));
            auVar226._8_4_ = 0xbf000000;
            auVar226._0_8_ = 0xbf000000bf000000;
            auVar226._12_4_ = 0xbf000000;
            auVar226._16_4_ = 0xbf000000;
            auVar226._20_4_ = 0xbf000000;
            auVar226._24_4_ = 0xbf000000;
            auVar226._28_4_ = 0xbf000000;
            fVar185 = auVar113._0_4_;
            fVar200 = auVar113._4_4_;
            fVar201 = auVar113._8_4_;
            fVar202 = auVar113._12_4_;
            fVar176 = auVar113._16_4_;
            fVar184 = auVar113._20_4_;
            fVar86 = auVar113._24_4_;
            auVar43._4_4_ = fVar200 * fVar200 * fVar200 * auVar93._4_4_ * -0.5;
            auVar43._0_4_ = fVar185 * fVar185 * fVar185 * auVar93._0_4_ * -0.5;
            auVar43._8_4_ = fVar201 * fVar201 * fVar201 * auVar93._8_4_ * -0.5;
            auVar43._12_4_ = fVar202 * fVar202 * fVar202 * auVar93._12_4_ * -0.5;
            auVar43._16_4_ = fVar176 * fVar176 * fVar176 * -0.0;
            auVar43._20_4_ = fVar184 * fVar184 * fVar184 * -0.0;
            auVar43._24_4_ = fVar86 * fVar86 * fVar86 * -0.0;
            auVar43._28_4_ = auVar127._28_4_;
            auVar111 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar113 = vfmadd231ps_avx512vl(auVar43,auVar111,auVar113);
            auVar44._4_4_ = auVar127._4_4_ * auVar113._4_4_;
            auVar44._0_4_ = auVar127._0_4_ * auVar113._0_4_;
            auVar44._8_4_ = auVar127._8_4_ * auVar113._8_4_;
            auVar44._12_4_ = auVar127._12_4_ * auVar113._12_4_;
            auVar44._16_4_ = auVar127._16_4_ * auVar113._16_4_;
            auVar44._20_4_ = auVar127._20_4_ * auVar113._20_4_;
            auVar44._24_4_ = auVar127._24_4_ * auVar113._24_4_;
            auVar44._28_4_ = 0;
            auVar45._4_4_ = auVar113._4_4_ * -auVar126._4_4_;
            auVar45._0_4_ = auVar113._0_4_ * -auVar126._0_4_;
            auVar45._8_4_ = auVar113._8_4_ * -auVar126._8_4_;
            auVar45._12_4_ = auVar113._12_4_ * -auVar126._12_4_;
            auVar45._16_4_ = auVar113._16_4_ * -auVar126._16_4_;
            auVar45._20_4_ = auVar113._20_4_ * -auVar126._20_4_;
            auVar45._24_4_ = auVar113._24_4_ * -auVar126._24_4_;
            auVar45._28_4_ = auVar127._28_4_;
            auVar110 = vmulps_avx512vl(auVar113,auVar107);
            auVar113 = vfmadd213ps_avx512vl(auVar128,auVar128,auVar107);
            auVar113 = vfmadd231ps_avx512vl(auVar113,auVar129,auVar129);
            auVar109 = vrsqrt14ps_avx512vl(auVar113);
            auVar113 = vmulps_avx512vl(auVar113,auVar226);
            fVar185 = auVar109._0_4_;
            fVar200 = auVar109._4_4_;
            fVar201 = auVar109._8_4_;
            fVar202 = auVar109._12_4_;
            fVar176 = auVar109._16_4_;
            fVar184 = auVar109._20_4_;
            fVar86 = auVar109._24_4_;
            auVar46._4_4_ = fVar200 * fVar200 * fVar200 * auVar113._4_4_;
            auVar46._0_4_ = fVar185 * fVar185 * fVar185 * auVar113._0_4_;
            auVar46._8_4_ = fVar201 * fVar201 * fVar201 * auVar113._8_4_;
            auVar46._12_4_ = fVar202 * fVar202 * fVar202 * auVar113._12_4_;
            auVar46._16_4_ = fVar176 * fVar176 * fVar176 * auVar113._16_4_;
            auVar46._20_4_ = fVar184 * fVar184 * fVar184 * auVar113._20_4_;
            auVar46._24_4_ = fVar86 * fVar86 * fVar86 * auVar113._24_4_;
            auVar46._28_4_ = auVar113._28_4_;
            auVar113 = vfmadd231ps_avx512vl(auVar46,auVar111,auVar109);
            auVar47._4_4_ = auVar129._4_4_ * auVar113._4_4_;
            auVar47._0_4_ = auVar129._0_4_ * auVar113._0_4_;
            auVar47._8_4_ = auVar129._8_4_ * auVar113._8_4_;
            auVar47._12_4_ = auVar129._12_4_ * auVar113._12_4_;
            auVar47._16_4_ = auVar129._16_4_ * auVar113._16_4_;
            auVar47._20_4_ = auVar129._20_4_ * auVar113._20_4_;
            auVar47._24_4_ = auVar129._24_4_ * auVar113._24_4_;
            auVar47._28_4_ = auVar109._28_4_;
            auVar48._4_4_ = auVar113._4_4_ * auVar112._4_4_;
            auVar48._0_4_ = auVar113._0_4_ * auVar112._0_4_;
            auVar48._8_4_ = auVar113._8_4_ * auVar112._8_4_;
            auVar48._12_4_ = auVar113._12_4_ * auVar112._12_4_;
            auVar48._16_4_ = auVar113._16_4_ * auVar112._16_4_;
            auVar48._20_4_ = auVar113._20_4_ * auVar112._20_4_;
            auVar48._24_4_ = auVar113._24_4_ * auVar112._24_4_;
            auVar48._28_4_ = auVar112._28_4_;
            auVar112 = vmulps_avx512vl(auVar113,auVar107);
            auVar93 = vfmadd213ps_fma(auVar44,ZEXT1632(auVar90),auVar103);
            auVar113 = ZEXT1632(auVar90);
            auVar98 = vfmadd213ps_fma(auVar45,auVar113,auVar104);
            auVar111 = vfmadd213ps_avx512vl(auVar110,auVar113,auVar100);
            auVar109 = vfmadd213ps_avx512vl(auVar47,ZEXT1632(auVar95),auVar105);
            auVar96 = vfnmadd213ps_fma(auVar44,auVar113,auVar103);
            auVar108 = ZEXT1632(auVar95);
            auVar230 = vfmadd213ps_fma(auVar48,auVar108,auVar106);
            auVar91 = vfnmadd213ps_fma(auVar45,auVar113,auVar104);
            auVar19 = vfmadd213ps_fma(auVar112,auVar108,auVar99);
            auVar104 = ZEXT1632(auVar90);
            auVar151 = vfnmadd231ps_fma(auVar100,auVar104,auVar110);
            auVar89 = vfnmadd213ps_fma(auVar47,auVar108,auVar105);
            auVar88 = vfnmadd213ps_fma(auVar48,auVar108,auVar106);
            auVar97 = vfnmadd231ps_fma(auVar99,ZEXT1632(auVar95),auVar112);
            auVar99 = vsubps_avx512vl(auVar109,ZEXT1632(auVar96));
            auVar112 = vsubps_avx(ZEXT1632(auVar230),ZEXT1632(auVar91));
            auVar113 = vsubps_avx(ZEXT1632(auVar19),ZEXT1632(auVar151));
            auVar49._4_4_ = auVar112._4_4_ * auVar151._4_4_;
            auVar49._0_4_ = auVar112._0_4_ * auVar151._0_4_;
            auVar49._8_4_ = auVar112._8_4_ * auVar151._8_4_;
            auVar49._12_4_ = auVar112._12_4_ * auVar151._12_4_;
            auVar49._16_4_ = auVar112._16_4_ * 0.0;
            auVar49._20_4_ = auVar112._20_4_ * 0.0;
            auVar49._24_4_ = auVar112._24_4_ * 0.0;
            auVar49._28_4_ = auVar110._28_4_;
            auVar90 = vfmsub231ps_fma(auVar49,ZEXT1632(auVar91),auVar113);
            auVar50._4_4_ = auVar113._4_4_ * auVar96._4_4_;
            auVar50._0_4_ = auVar113._0_4_ * auVar96._0_4_;
            auVar50._8_4_ = auVar113._8_4_ * auVar96._8_4_;
            auVar50._12_4_ = auVar113._12_4_ * auVar96._12_4_;
            auVar50._16_4_ = auVar113._16_4_ * 0.0;
            auVar50._20_4_ = auVar113._20_4_ * 0.0;
            auVar50._24_4_ = auVar113._24_4_ * 0.0;
            auVar50._28_4_ = auVar113._28_4_;
            auVar20 = vfmsub231ps_fma(auVar50,ZEXT1632(auVar151),auVar99);
            auVar51._4_4_ = auVar91._4_4_ * auVar99._4_4_;
            auVar51._0_4_ = auVar91._0_4_ * auVar99._0_4_;
            auVar51._8_4_ = auVar91._8_4_ * auVar99._8_4_;
            auVar51._12_4_ = auVar91._12_4_ * auVar99._12_4_;
            auVar51._16_4_ = auVar99._16_4_ * 0.0;
            auVar51._20_4_ = auVar99._20_4_ * 0.0;
            auVar51._24_4_ = auVar99._24_4_ * 0.0;
            auVar51._28_4_ = auVar99._28_4_;
            auVar94 = vfmsub231ps_fma(auVar51,ZEXT1632(auVar96),auVar112);
            auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),auVar107,ZEXT1632(auVar20));
            auVar112 = vfmadd231ps_avx512vl(auVar112,auVar107,ZEXT1632(auVar90));
            uVar77 = vcmpps_avx512vl(auVar112,auVar107,2);
            bVar85 = (byte)uVar77;
            fVar141 = (float)((uint)(bVar85 & 1) * auVar93._0_4_ |
                             (uint)!(bool)(bVar85 & 1) * auVar89._0_4_);
            bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
            fVar143 = (float)((uint)bVar12 * auVar93._4_4_ | (uint)!bVar12 * auVar89._4_4_);
            bVar12 = (bool)((byte)(uVar77 >> 2) & 1);
            fVar146 = (float)((uint)bVar12 * auVar93._8_4_ | (uint)!bVar12 * auVar89._8_4_);
            bVar12 = (bool)((byte)(uVar77 >> 3) & 1);
            fVar147 = (float)((uint)bVar12 * auVar93._12_4_ | (uint)!bVar12 * auVar89._12_4_);
            auVar108 = ZEXT1632(CONCAT412(fVar147,CONCAT48(fVar146,CONCAT44(fVar143,fVar141))));
            fVar142 = (float)((uint)(bVar85 & 1) * auVar98._0_4_ |
                             (uint)!(bool)(bVar85 & 1) * auVar88._0_4_);
            bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
            fVar145 = (float)((uint)bVar12 * auVar98._4_4_ | (uint)!bVar12 * auVar88._4_4_);
            bVar12 = (bool)((byte)(uVar77 >> 2) & 1);
            fVar144 = (float)((uint)bVar12 * auVar98._8_4_ | (uint)!bVar12 * auVar88._8_4_);
            bVar12 = (bool)((byte)(uVar77 >> 3) & 1);
            fVar148 = (float)((uint)bVar12 * auVar98._12_4_ | (uint)!bVar12 * auVar88._12_4_);
            auVar101 = ZEXT1632(CONCAT412(fVar148,CONCAT48(fVar144,CONCAT44(fVar145,fVar142))));
            auVar130._0_4_ =
                 (float)((uint)(bVar85 & 1) * auVar111._0_4_ |
                        (uint)!(bool)(bVar85 & 1) * auVar97._0_4_);
            bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
            auVar130._4_4_ = (float)((uint)bVar12 * auVar111._4_4_ | (uint)!bVar12 * auVar97._4_4_);
            bVar12 = (bool)((byte)(uVar77 >> 2) & 1);
            auVar130._8_4_ = (float)((uint)bVar12 * auVar111._8_4_ | (uint)!bVar12 * auVar97._8_4_);
            bVar12 = (bool)((byte)(uVar77 >> 3) & 1);
            auVar130._12_4_ =
                 (float)((uint)bVar12 * auVar111._12_4_ | (uint)!bVar12 * auVar97._12_4_);
            fVar185 = (float)((uint)((byte)(uVar77 >> 4) & 1) * auVar111._16_4_);
            auVar130._16_4_ = fVar185;
            fVar200 = (float)((uint)((byte)(uVar77 >> 5) & 1) * auVar111._20_4_);
            auVar130._20_4_ = fVar200;
            fVar201 = (float)((uint)((byte)(uVar77 >> 6) & 1) * auVar111._24_4_);
            auVar130._24_4_ = fVar201;
            iVar1 = (uint)(byte)(uVar77 >> 7) * auVar111._28_4_;
            auVar130._28_4_ = iVar1;
            auVar112 = vblendmps_avx512vl(ZEXT1632(auVar96),auVar109);
            auVar131._0_4_ =
                 (uint)(bVar85 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar90._0_4_;
            bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
            auVar131._4_4_ = (uint)bVar12 * auVar112._4_4_ | (uint)!bVar12 * auVar90._4_4_;
            bVar12 = (bool)((byte)(uVar77 >> 2) & 1);
            auVar131._8_4_ = (uint)bVar12 * auVar112._8_4_ | (uint)!bVar12 * auVar90._8_4_;
            bVar12 = (bool)((byte)(uVar77 >> 3) & 1);
            auVar131._12_4_ = (uint)bVar12 * auVar112._12_4_ | (uint)!bVar12 * auVar90._12_4_;
            auVar131._16_4_ = (uint)((byte)(uVar77 >> 4) & 1) * auVar112._16_4_;
            auVar131._20_4_ = (uint)((byte)(uVar77 >> 5) & 1) * auVar112._20_4_;
            auVar131._24_4_ = (uint)((byte)(uVar77 >> 6) & 1) * auVar112._24_4_;
            auVar131._28_4_ = (uint)(byte)(uVar77 >> 7) * auVar112._28_4_;
            auVar112 = vblendmps_avx512vl(ZEXT1632(auVar91),ZEXT1632(auVar230));
            auVar132._0_4_ =
                 (float)((uint)(bVar85 & 1) * auVar112._0_4_ |
                        (uint)!(bool)(bVar85 & 1) * auVar93._0_4_);
            bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
            auVar132._4_4_ = (float)((uint)bVar12 * auVar112._4_4_ | (uint)!bVar12 * auVar93._4_4_);
            bVar12 = (bool)((byte)(uVar77 >> 2) & 1);
            auVar132._8_4_ = (float)((uint)bVar12 * auVar112._8_4_ | (uint)!bVar12 * auVar93._8_4_);
            bVar12 = (bool)((byte)(uVar77 >> 3) & 1);
            auVar132._12_4_ =
                 (float)((uint)bVar12 * auVar112._12_4_ | (uint)!bVar12 * auVar93._12_4_);
            fVar176 = (float)((uint)((byte)(uVar77 >> 4) & 1) * auVar112._16_4_);
            auVar132._16_4_ = fVar176;
            fVar184 = (float)((uint)((byte)(uVar77 >> 5) & 1) * auVar112._20_4_);
            auVar132._20_4_ = fVar184;
            fVar202 = (float)((uint)((byte)(uVar77 >> 6) & 1) * auVar112._24_4_);
            auVar132._24_4_ = fVar202;
            auVar132._28_4_ = (uint)(byte)(uVar77 >> 7) * auVar112._28_4_;
            auVar112 = vblendmps_avx512vl(ZEXT1632(auVar151),ZEXT1632(auVar19));
            auVar133._0_4_ =
                 (float)((uint)(bVar85 & 1) * auVar112._0_4_ |
                        (uint)!(bool)(bVar85 & 1) * auVar98._0_4_);
            bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
            auVar133._4_4_ = (float)((uint)bVar12 * auVar112._4_4_ | (uint)!bVar12 * auVar98._4_4_);
            bVar12 = (bool)((byte)(uVar77 >> 2) & 1);
            auVar133._8_4_ = (float)((uint)bVar12 * auVar112._8_4_ | (uint)!bVar12 * auVar98._8_4_);
            bVar12 = (bool)((byte)(uVar77 >> 3) & 1);
            auVar133._12_4_ =
                 (float)((uint)bVar12 * auVar112._12_4_ | (uint)!bVar12 * auVar98._12_4_);
            fVar86 = (float)((uint)((byte)(uVar77 >> 4) & 1) * auVar112._16_4_);
            auVar133._16_4_ = fVar86;
            fVar87 = (float)((uint)((byte)(uVar77 >> 5) & 1) * auVar112._20_4_);
            auVar133._20_4_ = fVar87;
            fVar140 = (float)((uint)((byte)(uVar77 >> 6) & 1) * auVar112._24_4_);
            auVar133._24_4_ = fVar140;
            iVar2 = (uint)(byte)(uVar77 >> 7) * auVar112._28_4_;
            auVar133._28_4_ = iVar2;
            auVar134._0_4_ =
                 (uint)(bVar85 & 1) * (int)auVar96._0_4_ |
                 (uint)!(bool)(bVar85 & 1) * auVar109._0_4_;
            bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
            auVar134._4_4_ = (uint)bVar12 * (int)auVar96._4_4_ | (uint)!bVar12 * auVar109._4_4_;
            bVar12 = (bool)((byte)(uVar77 >> 2) & 1);
            auVar134._8_4_ = (uint)bVar12 * (int)auVar96._8_4_ | (uint)!bVar12 * auVar109._8_4_;
            bVar12 = (bool)((byte)(uVar77 >> 3) & 1);
            auVar134._12_4_ = (uint)bVar12 * (int)auVar96._12_4_ | (uint)!bVar12 * auVar109._12_4_;
            auVar134._16_4_ = (uint)!(bool)((byte)(uVar77 >> 4) & 1) * auVar109._16_4_;
            auVar134._20_4_ = (uint)!(bool)((byte)(uVar77 >> 5) & 1) * auVar109._20_4_;
            auVar134._24_4_ = (uint)!(bool)((byte)(uVar77 >> 6) & 1) * auVar109._24_4_;
            auVar134._28_4_ = (uint)!SUB81(uVar77 >> 7,0) * auVar109._28_4_;
            bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar77 >> 2) & 1);
            bVar16 = (bool)((byte)(uVar77 >> 3) & 1);
            bVar13 = (bool)((byte)(uVar77 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar77 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar77 >> 3) & 1);
            auVar109 = vsubps_avx512vl(auVar134,auVar108);
            auVar113 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar91._12_4_ |
                                                     (uint)!bVar16 * auVar230._12_4_,
                                                     CONCAT48((uint)bVar14 * (int)auVar91._8_4_ |
                                                              (uint)!bVar14 * auVar230._8_4_,
                                                              CONCAT44((uint)bVar12 *
                                                                       (int)auVar91._4_4_ |
                                                                       (uint)!bVar12 *
                                                                       auVar230._4_4_,
                                                                       (uint)(bVar85 & 1) *
                                                                       (int)auVar91._0_4_ |
                                                                       (uint)!(bool)(bVar85 & 1) *
                                                                       auVar230._0_4_)))),auVar101);
            auVar111 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar151._12_4_ |
                                                     (uint)!bVar17 * auVar19._12_4_,
                                                     CONCAT48((uint)bVar15 * (int)auVar151._8_4_ |
                                                              (uint)!bVar15 * auVar19._8_4_,
                                                              CONCAT44((uint)bVar13 *
                                                                       (int)auVar151._4_4_ |
                                                                       (uint)!bVar13 * auVar19._4_4_
                                                                       ,(uint)(bVar85 & 1) *
                                                                        (int)auVar151._0_4_ |
                                                                        (uint)!(bool)(bVar85 & 1) *
                                                                        auVar19._0_4_)))),auVar130);
            auVar110 = vsubps_avx(auVar108,auVar131);
            auVar99 = vsubps_avx(auVar101,auVar132);
            auVar100 = vsubps_avx(auVar130,auVar133);
            auVar52._4_4_ = auVar111._4_4_ * fVar143;
            auVar52._0_4_ = auVar111._0_4_ * fVar141;
            auVar52._8_4_ = auVar111._8_4_ * fVar146;
            auVar52._12_4_ = auVar111._12_4_ * fVar147;
            auVar52._16_4_ = auVar111._16_4_ * 0.0;
            auVar52._20_4_ = auVar111._20_4_ * 0.0;
            auVar52._24_4_ = auVar111._24_4_ * 0.0;
            auVar52._28_4_ = 0;
            auVar90 = vfmsub231ps_fma(auVar52,auVar130,auVar109);
            auVar182._0_4_ = fVar142 * auVar109._0_4_;
            auVar182._4_4_ = fVar145 * auVar109._4_4_;
            auVar182._8_4_ = fVar144 * auVar109._8_4_;
            auVar182._12_4_ = fVar148 * auVar109._12_4_;
            auVar182._16_4_ = auVar109._16_4_ * 0.0;
            auVar182._20_4_ = auVar109._20_4_ * 0.0;
            auVar182._24_4_ = auVar109._24_4_ * 0.0;
            auVar182._28_4_ = 0;
            auVar93 = vfmsub231ps_fma(auVar182,auVar108,auVar113);
            auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),auVar107,ZEXT1632(auVar90));
            auVar196._0_4_ = auVar113._0_4_ * auVar130._0_4_;
            auVar196._4_4_ = auVar113._4_4_ * auVar130._4_4_;
            auVar196._8_4_ = auVar113._8_4_ * auVar130._8_4_;
            auVar196._12_4_ = auVar113._12_4_ * auVar130._12_4_;
            auVar196._16_4_ = auVar113._16_4_ * fVar185;
            auVar196._20_4_ = auVar113._20_4_ * fVar200;
            auVar196._24_4_ = auVar113._24_4_ * fVar201;
            auVar196._28_4_ = 0;
            auVar90 = vfmsub231ps_fma(auVar196,auVar101,auVar111);
            auVar102 = vfmadd231ps_avx512vl(auVar112,auVar107,ZEXT1632(auVar90));
            auVar112 = vmulps_avx512vl(auVar100,auVar131);
            auVar112 = vfmsub231ps_avx512vl(auVar112,auVar110,auVar133);
            auVar53._4_4_ = auVar99._4_4_ * auVar133._4_4_;
            auVar53._0_4_ = auVar99._0_4_ * auVar133._0_4_;
            auVar53._8_4_ = auVar99._8_4_ * auVar133._8_4_;
            auVar53._12_4_ = auVar99._12_4_ * auVar133._12_4_;
            auVar53._16_4_ = auVar99._16_4_ * fVar86;
            auVar53._20_4_ = auVar99._20_4_ * fVar87;
            auVar53._24_4_ = auVar99._24_4_ * fVar140;
            auVar53._28_4_ = iVar2;
            auVar90 = vfmsub231ps_fma(auVar53,auVar132,auVar100);
            auVar197._0_4_ = auVar132._0_4_ * auVar110._0_4_;
            auVar197._4_4_ = auVar132._4_4_ * auVar110._4_4_;
            auVar197._8_4_ = auVar132._8_4_ * auVar110._8_4_;
            auVar197._12_4_ = auVar132._12_4_ * auVar110._12_4_;
            auVar197._16_4_ = fVar176 * auVar110._16_4_;
            auVar197._20_4_ = fVar184 * auVar110._20_4_;
            auVar197._24_4_ = fVar202 * auVar110._24_4_;
            auVar197._28_4_ = 0;
            auVar93 = vfmsub231ps_fma(auVar197,auVar99,auVar131);
            auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),auVar107,auVar112);
            auVar103 = vfmadd231ps_avx512vl(auVar112,auVar107,ZEXT1632(auVar90));
            auVar112 = vmaxps_avx(auVar102,auVar103);
            uVar150 = vcmpps_avx512vl(auVar112,auVar107,2);
            local_410 = local_410 & (byte)uVar150;
            if (local_410 == 0) {
LAB_01af9e3a:
              local_410 = 0;
            }
            else {
              auVar54._4_4_ = auVar100._4_4_ * auVar113._4_4_;
              auVar54._0_4_ = auVar100._0_4_ * auVar113._0_4_;
              auVar54._8_4_ = auVar100._8_4_ * auVar113._8_4_;
              auVar54._12_4_ = auVar100._12_4_ * auVar113._12_4_;
              auVar54._16_4_ = auVar100._16_4_ * auVar113._16_4_;
              auVar54._20_4_ = auVar100._20_4_ * auVar113._20_4_;
              auVar54._24_4_ = auVar100._24_4_ * auVar113._24_4_;
              auVar54._28_4_ = auVar112._28_4_;
              auVar98 = vfmsub231ps_fma(auVar54,auVar99,auVar111);
              auVar55._4_4_ = auVar111._4_4_ * auVar110._4_4_;
              auVar55._0_4_ = auVar111._0_4_ * auVar110._0_4_;
              auVar55._8_4_ = auVar111._8_4_ * auVar110._8_4_;
              auVar55._12_4_ = auVar111._12_4_ * auVar110._12_4_;
              auVar55._16_4_ = auVar111._16_4_ * auVar110._16_4_;
              auVar55._20_4_ = auVar111._20_4_ * auVar110._20_4_;
              auVar55._24_4_ = auVar111._24_4_ * auVar110._24_4_;
              auVar55._28_4_ = auVar111._28_4_;
              auVar93 = vfmsub231ps_fma(auVar55,auVar109,auVar100);
              auVar56._4_4_ = auVar99._4_4_ * auVar109._4_4_;
              auVar56._0_4_ = auVar99._0_4_ * auVar109._0_4_;
              auVar56._8_4_ = auVar99._8_4_ * auVar109._8_4_;
              auVar56._12_4_ = auVar99._12_4_ * auVar109._12_4_;
              auVar56._16_4_ = auVar99._16_4_ * auVar109._16_4_;
              auVar56._20_4_ = auVar99._20_4_ * auVar109._20_4_;
              auVar56._24_4_ = auVar99._24_4_ * auVar109._24_4_;
              auVar56._28_4_ = auVar99._28_4_;
              auVar230 = vfmsub231ps_fma(auVar56,auVar110,auVar113);
              auVar90 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar93),ZEXT1632(auVar230));
              auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),ZEXT1632(auVar98),auVar107);
              auVar113 = vrcp14ps_avx512vl(auVar112);
              auVar31._8_4_ = 0x3f800000;
              auVar31._0_8_ = &DAT_3f8000003f800000;
              auVar31._12_4_ = 0x3f800000;
              auVar31._16_4_ = 0x3f800000;
              auVar31._20_4_ = 0x3f800000;
              auVar31._24_4_ = 0x3f800000;
              auVar31._28_4_ = 0x3f800000;
              auVar111 = vfnmadd213ps_avx512vl(auVar113,auVar112,auVar31);
              auVar90 = vfmadd132ps_fma(auVar111,auVar113,auVar113);
              auVar57._4_4_ = auVar230._4_4_ * auVar130._4_4_;
              auVar57._0_4_ = auVar230._0_4_ * auVar130._0_4_;
              auVar57._8_4_ = auVar230._8_4_ * auVar130._8_4_;
              auVar57._12_4_ = auVar230._12_4_ * auVar130._12_4_;
              auVar57._16_4_ = fVar185 * 0.0;
              auVar57._20_4_ = fVar200 * 0.0;
              auVar57._24_4_ = fVar201 * 0.0;
              auVar57._28_4_ = iVar1;
              auVar93 = vfmadd231ps_fma(auVar57,auVar101,ZEXT1632(auVar93));
              auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar108,ZEXT1632(auVar98));
              fVar185 = auVar90._0_4_;
              fVar200 = auVar90._4_4_;
              fVar201 = auVar90._8_4_;
              fVar202 = auVar90._12_4_;
              auVar113 = ZEXT1632(CONCAT412(auVar93._12_4_ * fVar202,
                                            CONCAT48(auVar93._8_4_ * fVar201,
                                                     CONCAT44(auVar93._4_4_ * fVar200,
                                                              auVar93._0_4_ * fVar185))));
              auVar74._4_4_ = uStack_55c;
              auVar74._0_4_ = local_560;
              auVar74._8_4_ = uStack_558;
              auVar74._12_4_ = uStack_554;
              auVar74._16_4_ = uStack_550;
              auVar74._20_4_ = uStack_54c;
              auVar74._24_4_ = uStack_548;
              auVar74._28_4_ = uStack_544;
              uVar150 = vcmpps_avx512vl(auVar113,auVar74,0xd);
              uVar149 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar32._4_4_ = uVar149;
              auVar32._0_4_ = uVar149;
              auVar32._8_4_ = uVar149;
              auVar32._12_4_ = uVar149;
              auVar32._16_4_ = uVar149;
              auVar32._20_4_ = uVar149;
              auVar32._24_4_ = uVar149;
              auVar32._28_4_ = uVar149;
              uVar21 = vcmpps_avx512vl(auVar113,auVar32,2);
              local_410 = (byte)uVar150 & (byte)uVar21 & local_410;
              if (local_410 == 0) goto LAB_01af9e3a;
              uVar150 = vcmpps_avx512vl(auVar112,auVar107,4);
              if ((local_410 & (byte)uVar150) == 0) {
                local_410 = 0;
              }
              else {
                local_410 = local_410 & (byte)uVar150;
                fVar176 = auVar102._0_4_ * fVar185;
                fVar184 = auVar102._4_4_ * fVar200;
                auVar58._4_4_ = fVar184;
                auVar58._0_4_ = fVar176;
                fVar86 = auVar102._8_4_ * fVar201;
                auVar58._8_4_ = fVar86;
                fVar87 = auVar102._12_4_ * fVar202;
                auVar58._12_4_ = fVar87;
                fVar140 = auVar102._16_4_ * 0.0;
                auVar58._16_4_ = fVar140;
                fVar141 = auVar102._20_4_ * 0.0;
                auVar58._20_4_ = fVar141;
                fVar142 = auVar102._24_4_ * 0.0;
                auVar58._24_4_ = fVar142;
                auVar58._28_4_ = auVar102._28_4_;
                fVar185 = auVar103._0_4_ * fVar185;
                fVar200 = auVar103._4_4_ * fVar200;
                auVar59._4_4_ = fVar200;
                auVar59._0_4_ = fVar185;
                fVar201 = auVar103._8_4_ * fVar201;
                auVar59._8_4_ = fVar201;
                fVar202 = auVar103._12_4_ * fVar202;
                auVar59._12_4_ = fVar202;
                fVar143 = auVar103._16_4_ * 0.0;
                auVar59._16_4_ = fVar143;
                fVar145 = auVar103._20_4_ * 0.0;
                auVar59._20_4_ = fVar145;
                fVar146 = auVar103._24_4_ * 0.0;
                auVar59._24_4_ = fVar146;
                auVar59._28_4_ = auVar103._28_4_;
                auVar207._8_4_ = 0x3f800000;
                auVar207._0_8_ = &DAT_3f8000003f800000;
                auVar207._12_4_ = 0x3f800000;
                auVar207._16_4_ = 0x3f800000;
                auVar207._20_4_ = 0x3f800000;
                auVar207._24_4_ = 0x3f800000;
                auVar207._28_4_ = 0x3f800000;
                auVar112 = vsubps_avx512vl(auVar207,auVar58);
                bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
                bVar13 = (bool)((byte)(uVar77 >> 2) & 1);
                bVar14 = (bool)((byte)(uVar77 >> 3) & 1);
                bVar15 = (bool)((byte)(uVar77 >> 4) & 1);
                bVar16 = (bool)((byte)(uVar77 >> 5) & 1);
                bVar17 = (bool)((byte)(uVar77 >> 6) & 1);
                bVar18 = SUB81(uVar77 >> 7,0);
                in_ZMM20 = ZEXT3264(CONCAT428((uint)bVar18 * auVar102._28_4_ |
                                              (uint)!bVar18 * auVar112._28_4_,
                                              CONCAT424((uint)bVar17 * (int)fVar142 |
                                                        (uint)!bVar17 * auVar112._24_4_,
                                                        CONCAT420((uint)bVar16 * (int)fVar141 |
                                                                  (uint)!bVar16 * auVar112._20_4_,
                                                                  CONCAT416((uint)bVar15 *
                                                                            (int)fVar140 |
                                                                            (uint)!bVar15 *
                                                                            auVar112._16_4_,
                                                                            CONCAT412((uint)bVar14 *
                                                                                      (int)fVar87 |
                                                                                      (uint)!bVar14
                                                                                      * auVar112.
                                                  _12_4_,CONCAT48((uint)bVar13 * (int)fVar86 |
                                                                  (uint)!bVar13 * auVar112._8_4_,
                                                                  CONCAT44((uint)bVar12 *
                                                                           (int)fVar184 |
                                                                           (uint)!bVar12 *
                                                                           auVar112._4_4_,
                                                                           (uint)(bVar85 & 1) *
                                                                           (int)fVar176 |
                                                                           (uint)!(bool)(bVar85 & 1)
                                                                           * auVar112._0_4_))))))));
                auVar112 = vsubps_avx(auVar207,auVar59);
                bVar12 = (bool)((byte)(uVar77 >> 1) & 1);
                bVar13 = (bool)((byte)(uVar77 >> 2) & 1);
                bVar14 = (bool)((byte)(uVar77 >> 3) & 1);
                bVar15 = (bool)((byte)(uVar77 >> 4) & 1);
                bVar16 = (bool)((byte)(uVar77 >> 5) & 1);
                bVar17 = (bool)((byte)(uVar77 >> 6) & 1);
                bVar18 = SUB81(uVar77 >> 7,0);
                local_360._4_4_ = (uint)bVar12 * (int)fVar200 | (uint)!bVar12 * auVar112._4_4_;
                local_360._0_4_ =
                     (uint)(bVar85 & 1) * (int)fVar185 | (uint)!(bool)(bVar85 & 1) * auVar112._0_4_;
                local_360._8_4_ = (uint)bVar13 * (int)fVar201 | (uint)!bVar13 * auVar112._8_4_;
                local_360._12_4_ = (uint)bVar14 * (int)fVar202 | (uint)!bVar14 * auVar112._12_4_;
                local_360._16_4_ = (uint)bVar15 * (int)fVar143 | (uint)!bVar15 * auVar112._16_4_;
                local_360._20_4_ = (uint)bVar16 * (int)fVar145 | (uint)!bVar16 * auVar112._20_4_;
                local_360._24_4_ = (uint)bVar17 * (int)fVar146 | (uint)!bVar17 * auVar112._24_4_;
                local_360._28_4_ = (uint)bVar18 * auVar103._28_4_ | (uint)!bVar18 * auVar112._28_4_;
                in_ZMM21 = ZEXT3264(auVar113);
              }
            }
            auVar228 = ZEXT3264(local_6c0);
            auVar227 = ZEXT3264(local_6e0);
            if (local_410 != 0) {
              auVar112 = vsubps_avx(ZEXT1632(auVar95),auVar104);
              local_600 = in_ZMM20._0_32_;
              auVar112 = vfmadd213ps_avx512vl(auVar112,local_600,auVar104);
              auVar159._0_4_ = auVar112._0_4_ + auVar112._0_4_;
              auVar159._4_4_ = auVar112._4_4_ + auVar112._4_4_;
              auVar159._8_4_ = auVar112._8_4_ + auVar112._8_4_;
              auVar159._12_4_ = auVar112._12_4_ + auVar112._12_4_;
              auVar159._16_4_ = auVar112._16_4_ + auVar112._16_4_;
              auVar159._20_4_ = auVar112._20_4_ + auVar112._20_4_;
              auVar159._24_4_ = auVar112._24_4_ + auVar112._24_4_;
              auVar159._28_4_ = auVar112._28_4_ + auVar112._28_4_;
              uVar149 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
              auVar33._4_4_ = uVar149;
              auVar33._0_4_ = uVar149;
              auVar33._8_4_ = uVar149;
              auVar33._12_4_ = uVar149;
              auVar33._16_4_ = uVar149;
              auVar33._20_4_ = uVar149;
              auVar33._24_4_ = uVar149;
              auVar33._28_4_ = uVar149;
              auVar112 = vmulps_avx512vl(auVar159,auVar33);
              local_620 = in_ZMM21._0_32_;
              uVar150 = vcmpps_avx512vl(local_620,auVar112,6);
              local_410 = local_410 & (byte)uVar150;
              if (local_410 != 0) {
                auVar160._8_4_ = 0xbf800000;
                auVar160._0_8_ = 0xbf800000bf800000;
                auVar160._12_4_ = 0xbf800000;
                auVar160._16_4_ = 0xbf800000;
                auVar160._20_4_ = 0xbf800000;
                auVar160._24_4_ = 0xbf800000;
                auVar160._28_4_ = 0xbf800000;
                auVar34._8_4_ = 0x40000000;
                auVar34._0_8_ = 0x4000000040000000;
                auVar34._12_4_ = 0x40000000;
                auVar34._16_4_ = 0x40000000;
                auVar34._20_4_ = 0x40000000;
                auVar34._24_4_ = 0x40000000;
                auVar34._28_4_ = 0x40000000;
                local_4a0 = vfmadd132ps_avx512vl(local_360,auVar160,auVar34);
                local_360 = local_4a0;
                auVar112 = local_360;
                local_460 = (undefined4)lVar82;
                local_440 = local_670._0_8_;
                uStack_438 = local_670._8_8_;
                local_430 = local_680._0_8_;
                uStack_428 = local_680._8_8_;
                local_420 = local_690;
                uStack_418 = uStack_688;
                pGVar9 = (context->scene->geometries).items[uVar83].ptr;
                local_360 = auVar112;
                if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  auVar112 = vaddps_avx512vl(local_600,_DAT_02020f40);
                  auVar90 = vcvtsi2ss_avx512f(local_80._0_16_,local_460);
                  fVar185 = auVar90._0_4_;
                  local_400[0] = (fVar185 + auVar112._0_4_) * (float)local_580._0_4_;
                  local_400[1] = (fVar185 + auVar112._4_4_) * (float)local_580._4_4_;
                  local_400[2] = (fVar185 + auVar112._8_4_) * fStack_578;
                  local_400[3] = (fVar185 + auVar112._12_4_) * fStack_574;
                  fStack_3f0 = (fVar185 + auVar112._16_4_) * fStack_570;
                  fStack_3ec = (fVar185 + auVar112._20_4_) * fStack_56c;
                  fStack_3e8 = (fVar185 + auVar112._24_4_) * fStack_568;
                  fStack_3e4 = fVar185 + auVar112._28_4_;
                  local_360._0_8_ = local_4a0._0_8_;
                  local_360._8_8_ = local_4a0._8_8_;
                  local_360._16_8_ = local_4a0._16_8_;
                  local_360._24_8_ = local_4a0._24_8_;
                  local_3e0 = local_360._0_8_;
                  uStack_3d8 = local_360._8_8_;
                  uStack_3d0 = local_360._16_8_;
                  uStack_3c8 = local_360._24_8_;
                  local_3c0 = local_620;
                  auVar161._8_4_ = 0x7f800000;
                  auVar161._0_8_ = 0x7f8000007f800000;
                  auVar161._12_4_ = 0x7f800000;
                  auVar161._16_4_ = 0x7f800000;
                  auVar161._20_4_ = 0x7f800000;
                  auVar161._24_4_ = 0x7f800000;
                  auVar161._28_4_ = 0x7f800000;
                  auVar112 = vblendmps_avx512vl(auVar161,local_620);
                  auVar135._0_4_ =
                       (uint)(local_410 & 1) * auVar112._0_4_ |
                       (uint)!(bool)(local_410 & 1) * 0x7f800000;
                  bVar12 = (bool)(local_410 >> 1 & 1);
                  auVar135._4_4_ = (uint)bVar12 * auVar112._4_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)(local_410 >> 2 & 1);
                  auVar135._8_4_ = (uint)bVar12 * auVar112._8_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)(local_410 >> 3 & 1);
                  auVar135._12_4_ = (uint)bVar12 * auVar112._12_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)(local_410 >> 4 & 1);
                  auVar135._16_4_ = (uint)bVar12 * auVar112._16_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)(local_410 >> 5 & 1);
                  auVar135._20_4_ = (uint)bVar12 * auVar112._20_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)(local_410 >> 6 & 1);
                  auVar135._24_4_ = (uint)bVar12 * auVar112._24_4_ | (uint)!bVar12 * 0x7f800000;
                  auVar135._28_4_ =
                       (uint)(local_410 >> 7) * auVar112._28_4_ |
                       (uint)!(bool)(local_410 >> 7) * 0x7f800000;
                  auVar112 = vshufps_avx(auVar135,auVar135,0xb1);
                  auVar112 = vminps_avx(auVar135,auVar112);
                  auVar113 = vshufpd_avx(auVar112,auVar112,5);
                  auVar112 = vminps_avx(auVar112,auVar113);
                  auVar113 = vpermpd_avx2(auVar112,0x4e);
                  auVar112 = vminps_avx(auVar112,auVar113);
                  uVar150 = vcmpps_avx512vl(auVar135,auVar112,0);
                  bVar76 = (byte)uVar150 & local_410;
                  bVar85 = local_410;
                  if (bVar76 != 0) {
                    bVar85 = bVar76;
                  }
                  uVar217 = 0;
                  for (uVar79 = (uint)bVar85; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000)
                  {
                    uVar217 = uVar217 + 1;
                  }
                  uVar77 = (ulong)uVar217;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar185 = local_400[uVar77];
                    uVar149 = *(undefined4 *)((long)&local_3e0 + uVar77 * 4);
                    fVar200 = 1.0 - fVar185;
                    auVar25._8_4_ = 0x80000000;
                    auVar25._0_8_ = 0x8000000080000000;
                    auVar25._12_4_ = 0x80000000;
                    auVar93 = vxorps_avx512vl(ZEXT416((uint)fVar200),auVar25);
                    auVar90 = ZEXT416((uint)(fVar185 * fVar200 * 4.0));
                    auVar95 = vfnmsub213ss_fma(ZEXT416((uint)fVar185),ZEXT416((uint)fVar185),auVar90
                                              );
                    auVar90 = vfmadd213ss_fma(ZEXT416((uint)fVar200),ZEXT416((uint)fVar200),auVar90)
                    ;
                    fVar200 = fVar200 * auVar93._0_4_ * 0.5;
                    fVar201 = auVar95._0_4_ * 0.5;
                    fVar202 = auVar90._0_4_ * 0.5;
                    fVar176 = fVar185 * fVar185 * 0.5;
                    auVar190._0_4_ = fVar176 * (float)local_690._0_4_;
                    auVar190._4_4_ = fVar176 * (float)local_690._4_4_;
                    auVar190._8_4_ = fVar176 * (float)uStack_688;
                    auVar190._12_4_ = fVar176 * uStack_688._4_4_;
                    auVar174._4_4_ = fVar202;
                    auVar174._0_4_ = fVar202;
                    auVar174._8_4_ = fVar202;
                    auVar174._12_4_ = fVar202;
                    auVar90 = vfmadd132ps_fma(auVar174,auVar190,local_680);
                    auVar191._4_4_ = fVar201;
                    auVar191._0_4_ = fVar201;
                    auVar191._8_4_ = fVar201;
                    auVar191._12_4_ = fVar201;
                    auVar90 = vfmadd132ps_fma(auVar191,auVar90,local_670);
                    auVar175._4_4_ = fVar200;
                    auVar175._0_4_ = fVar200;
                    auVar175._8_4_ = fVar200;
                    auVar175._12_4_ = fVar200;
                    auVar90 = vfmadd213ps_fma(auVar175,auVar92,auVar90);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3c0 + uVar77 * 4);
                    *(int *)(ray + k * 4 + 0x180) = auVar90._0_4_;
                    uVar8 = vextractps_avx(auVar90,1);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar8;
                    uVar8 = vextractps_avx(auVar90,2);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar8;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar185;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar149;
                    *(undefined4 *)(ray + k * 4 + 0x220) = uVar3;
                    *(uint *)(ray + k * 4 + 0x240) = uVar83;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    local_5a0 = local_670._0_8_;
                    uStack_598 = local_670._8_8_;
                    local_5b0 = local_680._0_4_;
                    fStack_5ac = local_680._4_4_;
                    fStack_5a8 = local_680._8_4_;
                    fStack_5a4 = local_680._12_4_;
                    local_300 = local_690;
                    uStack_2f8 = uStack_688;
                    local_6f0 = lVar82;
                    local_4c0 = local_600;
                    local_480 = local_620;
                    local_45c = iVar7;
                    local_450 = auVar92;
                    bVar85 = local_410;
                    do {
                      auVar112 = local_3a0;
                      local_3a0._1_3_ = 0;
                      local_3a0[0] = bVar85;
                      auVar98 = auVar231._0_16_;
                      local_3a0._4_28_ = auVar112._4_28_;
                      local_590 = *(undefined4 *)(ray + k * 4 + 0x100);
                      fVar185 = local_400[uVar77];
                      auVar166._4_4_ = fVar185;
                      auVar166._0_4_ = fVar185;
                      auVar166._8_4_ = fVar185;
                      auVar166._12_4_ = fVar185;
                      local_260._16_4_ = fVar185;
                      local_260._0_16_ = auVar166;
                      local_260._20_4_ = fVar185;
                      local_260._24_4_ = fVar185;
                      local_260._28_4_ = fVar185;
                      local_240 = *(undefined4 *)((long)&local_3e0 + uVar77 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3c0 + uVar77 * 4)
                      ;
                      local_720.context = context->user;
                      fVar200 = 1.0 - fVar185;
                      auVar26._8_4_ = 0x80000000;
                      auVar26._0_8_ = 0x8000000080000000;
                      auVar26._12_4_ = 0x80000000;
                      auVar93 = vxorps_avx512vl(ZEXT416((uint)fVar200),auVar26);
                      auVar90 = ZEXT416((uint)(fVar185 * fVar200 * 4.0));
                      auVar95 = vfnmsub213ss_fma(auVar166,auVar166,auVar90);
                      auVar90 = vfmadd213ss_fma(ZEXT416((uint)fVar200),ZEXT416((uint)fVar200),
                                                auVar90);
                      fVar200 = fVar200 * auVar93._0_4_ * 0.5;
                      fVar201 = auVar95._0_4_ * 0.5;
                      fVar202 = auVar90._0_4_ * 0.5;
                      fVar185 = fVar185 * fVar185 * 0.5;
                      auVar204._0_4_ = fVar185 * (float)local_300;
                      auVar204._4_4_ = fVar185 * local_300._4_4_;
                      auVar204._8_4_ = fVar185 * (float)uStack_2f8;
                      auVar204._12_4_ = fVar185 * uStack_2f8._4_4_;
                      auVar153._4_4_ = fVar202;
                      auVar153._0_4_ = fVar202;
                      auVar153._8_4_ = fVar202;
                      auVar153._12_4_ = fVar202;
                      auVar70._4_4_ = fStack_5ac;
                      auVar70._0_4_ = local_5b0;
                      auVar70._8_4_ = fStack_5a8;
                      auVar70._12_4_ = fStack_5a4;
                      auVar90 = vfmadd132ps_fma(auVar153,auVar204,auVar70);
                      auVar192._4_4_ = fVar201;
                      auVar192._0_4_ = fVar201;
                      auVar192._8_4_ = fVar201;
                      auVar192._12_4_ = fVar201;
                      auVar71._8_8_ = uStack_598;
                      auVar71._0_8_ = local_5a0;
                      auVar90 = vfmadd132ps_fma(auVar192,auVar90,auVar71);
                      auVar154._4_4_ = fVar200;
                      auVar154._0_4_ = fVar200;
                      auVar154._8_4_ = fVar200;
                      auVar154._12_4_ = fVar200;
                      auVar90 = vfmadd213ps_fma(auVar154,auVar92,auVar90);
                      local_2c0 = auVar90._0_4_;
                      auVar198._8_4_ = 1;
                      auVar198._0_8_ = 0x100000001;
                      auVar198._12_4_ = 1;
                      auVar198._16_4_ = 1;
                      auVar198._20_4_ = 1;
                      auVar198._24_4_ = 1;
                      auVar198._28_4_ = 1;
                      local_2a0 = vpermps_avx2(auVar198,ZEXT1632(auVar90));
                      auVar208._8_4_ = 2;
                      auVar208._0_8_ = 0x200000002;
                      auVar208._12_4_ = 2;
                      auVar208._16_4_ = 2;
                      auVar208._20_4_ = 2;
                      auVar208._24_4_ = 2;
                      auVar208._28_4_ = 2;
                      local_280 = vpermps_avx2(auVar208,ZEXT1632(auVar90));
                      iStack_2bc = local_2c0;
                      iStack_2b8 = local_2c0;
                      iStack_2b4 = local_2c0;
                      iStack_2b0 = local_2c0;
                      iStack_2ac = local_2c0;
                      iStack_2a8 = local_2c0;
                      iStack_2a4 = local_2c0;
                      uStack_23c = local_240;
                      uStack_238 = local_240;
                      uStack_234 = local_240;
                      uStack_230 = local_240;
                      uStack_22c = local_240;
                      uStack_228 = local_240;
                      uStack_224 = local_240;
                      local_220 = local_380._0_8_;
                      uStack_218 = local_380._8_8_;
                      uStack_210 = local_380._16_8_;
                      uStack_208 = local_380._24_8_;
                      local_200 = local_4e0;
                      auVar112 = vpcmpeqd_avx2(local_4e0,local_4e0);
                      local_6e8[1] = auVar112;
                      *local_6e8 = auVar112;
                      local_1e0 = (local_720.context)->instID[0];
                      uStack_1dc = local_1e0;
                      uStack_1d8 = local_1e0;
                      uStack_1d4 = local_1e0;
                      uStack_1d0 = local_1e0;
                      uStack_1cc = local_1e0;
                      uStack_1c8 = local_1e0;
                      uStack_1c4 = local_1e0;
                      local_1c0 = (local_720.context)->instPrimID[0];
                      uStack_1bc = local_1c0;
                      uStack_1b8 = local_1c0;
                      uStack_1b4 = local_1c0;
                      uStack_1b0 = local_1c0;
                      uStack_1ac = local_1c0;
                      uStack_1a8 = local_1c0;
                      uStack_1a4 = local_1c0;
                      local_5e0 = local_2e0._0_8_;
                      uStack_5d8 = local_2e0._8_8_;
                      uStack_5d0 = local_2e0._16_8_;
                      uStack_5c8 = local_2e0._24_8_;
                      local_720.valid = (int *)&local_5e0;
                      local_720.geometryUserPtr = pGVar9->userPtr;
                      local_720.hit = (RTCHitN *)&local_2c0;
                      local_720.N = 8;
                      local_720.ray = (RTCRayN *)ray;
                      if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar9->intersectionFilterN)(&local_720);
                        auVar233 = ZEXT3264(local_660);
                        auVar232 = ZEXT3264(local_640);
                        auVar227 = ZEXT3264(local_6e0);
                        auVar228 = ZEXT3264(local_6c0);
                        auVar229 = ZEXT3264(local_520);
                        in_ZMM21 = ZEXT3264(local_620);
                        in_ZMM20 = ZEXT3264(local_600);
                        auVar90 = vxorps_avx512vl(auVar98,auVar98);
                        auVar231 = ZEXT1664(auVar90);
                        lVar82 = local_6f0;
                      }
                      auVar90 = auVar231._0_16_;
                      auVar66._8_8_ = uStack_5d8;
                      auVar66._0_8_ = local_5e0;
                      auVar66._16_8_ = uStack_5d0;
                      auVar66._24_8_ = uStack_5c8;
                      if (auVar66 == (undefined1  [32])0x0) {
LAB_01afa283:
                        *(undefined4 *)(ray + k * 4 + 0x100) = local_590;
                      }
                      else {
                        p_Var10 = context->args->filter;
                        if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var10)(&local_720);
                          auVar233 = ZEXT3264(local_660);
                          auVar232 = ZEXT3264(local_640);
                          auVar227 = ZEXT3264(local_6e0);
                          auVar228 = ZEXT3264(local_6c0);
                          auVar229 = ZEXT3264(local_520);
                          in_ZMM21 = ZEXT3264(local_620);
                          in_ZMM20 = ZEXT3264(local_600);
                          auVar90 = vxorps_avx512vl(auVar90,auVar90);
                          auVar231 = ZEXT1664(auVar90);
                          lVar82 = local_6f0;
                        }
                        auVar67._8_8_ = uStack_5d8;
                        auVar67._0_8_ = local_5e0;
                        auVar67._16_8_ = uStack_5d0;
                        auVar67._24_8_ = uStack_5c8;
                        if (auVar67 == (undefined1  [32])0x0) goto LAB_01afa283;
                        uVar81 = vptestmd_avx512vl(auVar67,auVar67);
                        iVar1 = *(int *)(local_720.hit + 4);
                        iVar2 = *(int *)(local_720.hit + 8);
                        iVar61 = *(int *)(local_720.hit + 0xc);
                        iVar62 = *(int *)(local_720.hit + 0x10);
                        iVar63 = *(int *)(local_720.hit + 0x14);
                        iVar64 = *(int *)(local_720.hit + 0x18);
                        iVar65 = *(int *)(local_720.hit + 0x1c);
                        bVar85 = (byte)uVar81;
                        bVar12 = (bool)((byte)(uVar81 >> 1) & 1);
                        bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
                        bVar14 = (bool)((byte)(uVar81 >> 3) & 1);
                        bVar15 = (bool)((byte)(uVar81 >> 4) & 1);
                        bVar16 = (bool)((byte)(uVar81 >> 5) & 1);
                        bVar17 = (bool)((byte)(uVar81 >> 6) & 1);
                        bVar18 = SUB81(uVar81 >> 7,0);
                        *(uint *)(local_720.ray + 0x180) =
                             (uint)(bVar85 & 1) * *(int *)local_720.hit |
                             (uint)!(bool)(bVar85 & 1) * *(int *)(local_720.ray + 0x180);
                        *(uint *)(local_720.ray + 0x184) =
                             (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_720.ray + 0x184);
                        *(uint *)(local_720.ray + 0x188) =
                             (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_720.ray + 0x188);
                        *(uint *)(local_720.ray + 0x18c) =
                             (uint)bVar14 * iVar61 | (uint)!bVar14 * *(int *)(local_720.ray + 0x18c)
                        ;
                        *(uint *)(local_720.ray + 400) =
                             (uint)bVar15 * iVar62 | (uint)!bVar15 * *(int *)(local_720.ray + 400);
                        *(uint *)(local_720.ray + 0x194) =
                             (uint)bVar16 * iVar63 | (uint)!bVar16 * *(int *)(local_720.ray + 0x194)
                        ;
                        *(uint *)(local_720.ray + 0x198) =
                             (uint)bVar17 * iVar64 | (uint)!bVar17 * *(int *)(local_720.ray + 0x198)
                        ;
                        *(uint *)(local_720.ray + 0x19c) =
                             (uint)bVar18 * iVar65 | (uint)!bVar18 * *(int *)(local_720.ray + 0x19c)
                        ;
                        iVar1 = *(int *)(local_720.hit + 0x24);
                        iVar2 = *(int *)(local_720.hit + 0x28);
                        iVar61 = *(int *)(local_720.hit + 0x2c);
                        iVar62 = *(int *)(local_720.hit + 0x30);
                        iVar63 = *(int *)(local_720.hit + 0x34);
                        iVar64 = *(int *)(local_720.hit + 0x38);
                        iVar65 = *(int *)(local_720.hit + 0x3c);
                        bVar12 = (bool)((byte)(uVar81 >> 1) & 1);
                        bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
                        bVar14 = (bool)((byte)(uVar81 >> 3) & 1);
                        bVar15 = (bool)((byte)(uVar81 >> 4) & 1);
                        bVar16 = (bool)((byte)(uVar81 >> 5) & 1);
                        bVar17 = (bool)((byte)(uVar81 >> 6) & 1);
                        bVar18 = SUB81(uVar81 >> 7,0);
                        *(uint *)(local_720.ray + 0x1a0) =
                             (uint)(bVar85 & 1) * *(int *)(local_720.hit + 0x20) |
                             (uint)!(bool)(bVar85 & 1) * *(int *)(local_720.ray + 0x1a0);
                        *(uint *)(local_720.ray + 0x1a4) =
                             (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_720.ray + 0x1a4);
                        *(uint *)(local_720.ray + 0x1a8) =
                             (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_720.ray + 0x1a8);
                        *(uint *)(local_720.ray + 0x1ac) =
                             (uint)bVar14 * iVar61 | (uint)!bVar14 * *(int *)(local_720.ray + 0x1ac)
                        ;
                        *(uint *)(local_720.ray + 0x1b0) =
                             (uint)bVar15 * iVar62 | (uint)!bVar15 * *(int *)(local_720.ray + 0x1b0)
                        ;
                        *(uint *)(local_720.ray + 0x1b4) =
                             (uint)bVar16 * iVar63 | (uint)!bVar16 * *(int *)(local_720.ray + 0x1b4)
                        ;
                        *(uint *)(local_720.ray + 0x1b8) =
                             (uint)bVar17 * iVar64 | (uint)!bVar17 * *(int *)(local_720.ray + 0x1b8)
                        ;
                        *(uint *)(local_720.ray + 0x1bc) =
                             (uint)bVar18 * iVar65 | (uint)!bVar18 * *(int *)(local_720.ray + 0x1bc)
                        ;
                        iVar1 = *(int *)(local_720.hit + 0x44);
                        iVar2 = *(int *)(local_720.hit + 0x48);
                        iVar61 = *(int *)(local_720.hit + 0x4c);
                        iVar62 = *(int *)(local_720.hit + 0x50);
                        iVar63 = *(int *)(local_720.hit + 0x54);
                        iVar64 = *(int *)(local_720.hit + 0x58);
                        iVar65 = *(int *)(local_720.hit + 0x5c);
                        bVar12 = (bool)((byte)(uVar81 >> 1) & 1);
                        bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
                        bVar14 = (bool)((byte)(uVar81 >> 3) & 1);
                        bVar15 = (bool)((byte)(uVar81 >> 4) & 1);
                        bVar16 = (bool)((byte)(uVar81 >> 5) & 1);
                        bVar17 = (bool)((byte)(uVar81 >> 6) & 1);
                        bVar18 = SUB81(uVar81 >> 7,0);
                        *(uint *)(local_720.ray + 0x1c0) =
                             (uint)(bVar85 & 1) * *(int *)(local_720.hit + 0x40) |
                             (uint)!(bool)(bVar85 & 1) * *(int *)(local_720.ray + 0x1c0);
                        *(uint *)(local_720.ray + 0x1c4) =
                             (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_720.ray + 0x1c4);
                        *(uint *)(local_720.ray + 0x1c8) =
                             (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_720.ray + 0x1c8);
                        *(uint *)(local_720.ray + 0x1cc) =
                             (uint)bVar14 * iVar61 | (uint)!bVar14 * *(int *)(local_720.ray + 0x1cc)
                        ;
                        *(uint *)(local_720.ray + 0x1d0) =
                             (uint)bVar15 * iVar62 | (uint)!bVar15 * *(int *)(local_720.ray + 0x1d0)
                        ;
                        *(uint *)(local_720.ray + 0x1d4) =
                             (uint)bVar16 * iVar63 | (uint)!bVar16 * *(int *)(local_720.ray + 0x1d4)
                        ;
                        *(uint *)(local_720.ray + 0x1d8) =
                             (uint)bVar17 * iVar64 | (uint)!bVar17 * *(int *)(local_720.ray + 0x1d8)
                        ;
                        *(uint *)(local_720.ray + 0x1dc) =
                             (uint)bVar18 * iVar65 | (uint)!bVar18 * *(int *)(local_720.ray + 0x1dc)
                        ;
                        iVar1 = *(int *)(local_720.hit + 100);
                        iVar2 = *(int *)(local_720.hit + 0x68);
                        iVar61 = *(int *)(local_720.hit + 0x6c);
                        iVar62 = *(int *)(local_720.hit + 0x70);
                        iVar63 = *(int *)(local_720.hit + 0x74);
                        iVar64 = *(int *)(local_720.hit + 0x78);
                        iVar65 = *(int *)(local_720.hit + 0x7c);
                        bVar12 = (bool)((byte)(uVar81 >> 1) & 1);
                        bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
                        bVar14 = (bool)((byte)(uVar81 >> 3) & 1);
                        bVar15 = (bool)((byte)(uVar81 >> 4) & 1);
                        bVar16 = (bool)((byte)(uVar81 >> 5) & 1);
                        bVar17 = (bool)((byte)(uVar81 >> 6) & 1);
                        bVar18 = SUB81(uVar81 >> 7,0);
                        *(uint *)(local_720.ray + 0x1e0) =
                             (uint)(bVar85 & 1) * *(int *)(local_720.hit + 0x60) |
                             (uint)!(bool)(bVar85 & 1) * *(int *)(local_720.ray + 0x1e0);
                        *(uint *)(local_720.ray + 0x1e4) =
                             (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_720.ray + 0x1e4);
                        *(uint *)(local_720.ray + 0x1e8) =
                             (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_720.ray + 0x1e8);
                        *(uint *)(local_720.ray + 0x1ec) =
                             (uint)bVar14 * iVar61 | (uint)!bVar14 * *(int *)(local_720.ray + 0x1ec)
                        ;
                        *(uint *)(local_720.ray + 0x1f0) =
                             (uint)bVar15 * iVar62 | (uint)!bVar15 * *(int *)(local_720.ray + 0x1f0)
                        ;
                        *(uint *)(local_720.ray + 500) =
                             (uint)bVar16 * iVar63 | (uint)!bVar16 * *(int *)(local_720.ray + 500);
                        *(uint *)(local_720.ray + 0x1f8) =
                             (uint)bVar17 * iVar64 | (uint)!bVar17 * *(int *)(local_720.ray + 0x1f8)
                        ;
                        *(uint *)(local_720.ray + 0x1fc) =
                             (uint)bVar18 * iVar65 | (uint)!bVar18 * *(int *)(local_720.ray + 0x1fc)
                        ;
                        auVar136._0_4_ =
                             (uint)(bVar85 & 1) * *(int *)(local_720.hit + 0x80) |
                             (uint)!(bool)(bVar85 & 1) * *(int *)(local_720.ray + 0x200);
                        bVar12 = (bool)((byte)(uVar81 >> 1) & 1);
                        auVar136._4_4_ =
                             (uint)bVar12 * *(int *)(local_720.hit + 0x84) |
                             (uint)!bVar12 * *(int *)(local_720.ray + 0x204);
                        bVar12 = (bool)((byte)(uVar81 >> 2) & 1);
                        auVar136._8_4_ =
                             (uint)bVar12 * *(int *)(local_720.hit + 0x88) |
                             (uint)!bVar12 * *(int *)(local_720.ray + 0x208);
                        bVar12 = (bool)((byte)(uVar81 >> 3) & 1);
                        auVar136._12_4_ =
                             (uint)bVar12 * *(int *)(local_720.hit + 0x8c) |
                             (uint)!bVar12 * *(int *)(local_720.ray + 0x20c);
                        bVar12 = (bool)((byte)(uVar81 >> 4) & 1);
                        auVar136._16_4_ =
                             (uint)bVar12 * *(int *)(local_720.hit + 0x90) |
                             (uint)!bVar12 * *(int *)(local_720.ray + 0x210);
                        bVar12 = (bool)((byte)(uVar81 >> 5) & 1);
                        auVar136._20_4_ =
                             (uint)bVar12 * *(int *)(local_720.hit + 0x94) |
                             (uint)!bVar12 * *(int *)(local_720.ray + 0x214);
                        bVar12 = (bool)((byte)(uVar81 >> 6) & 1);
                        auVar136._24_4_ =
                             (uint)bVar12 * *(int *)(local_720.hit + 0x98) |
                             (uint)!bVar12 * *(int *)(local_720.ray + 0x218);
                        bVar12 = SUB81(uVar81 >> 7,0);
                        auVar136._28_4_ =
                             (uint)bVar12 * *(int *)(local_720.hit + 0x9c) |
                             (uint)!bVar12 * *(int *)(local_720.ray + 0x21c);
                        *(undefined1 (*) [32])(local_720.ray + 0x200) = auVar136;
                        auVar112 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_720.hit + 0xa0));
                        *(undefined1 (*) [32])(local_720.ray + 0x220) = auVar112;
                        auVar112 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_720.hit + 0xc0));
                        *(undefined1 (*) [32])(local_720.ray + 0x240) = auVar112;
                        auVar112 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_720.hit + 0xe0));
                        *(undefined1 (*) [32])(local_720.ray + 0x260) = auVar112;
                        auVar112 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_720.hit + 0x100))
                        ;
                        *(undefined1 (*) [32])(local_720.ray + 0x280) = auVar112;
                      }
                      bVar76 = ~(byte)(1 << ((uint)uVar77 & 0x1f)) & local_3a0[0];
                      uVar149 = *(undefined4 *)(ray + k * 4 + 0x100);
                      auVar35._4_4_ = uVar149;
                      auVar35._0_4_ = uVar149;
                      auVar35._8_4_ = uVar149;
                      auVar35._12_4_ = uVar149;
                      auVar35._16_4_ = uVar149;
                      auVar35._20_4_ = uVar149;
                      auVar35._24_4_ = uVar149;
                      auVar35._28_4_ = uVar149;
                      uVar150 = vcmpps_avx512vl(in_ZMM21._0_32_,auVar35,2);
                      bVar85 = bVar76 & (byte)uVar150;
                      if ((bVar76 & (byte)uVar150) != 0) {
                        auVar162._8_4_ = 0x7f800000;
                        auVar162._0_8_ = 0x7f8000007f800000;
                        auVar162._12_4_ = 0x7f800000;
                        auVar162._16_4_ = 0x7f800000;
                        auVar162._20_4_ = 0x7f800000;
                        auVar162._24_4_ = 0x7f800000;
                        auVar162._28_4_ = 0x7f800000;
                        auVar112 = vblendmps_avx512vl(auVar162,in_ZMM21._0_32_);
                        auVar137._0_4_ =
                             (uint)(bVar85 & 1) * auVar112._0_4_ |
                             (uint)!(bool)(bVar85 & 1) * 0x7f800000;
                        bVar12 = (bool)(bVar85 >> 1 & 1);
                        auVar137._4_4_ = (uint)bVar12 * auVar112._4_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar85 >> 2 & 1);
                        auVar137._8_4_ = (uint)bVar12 * auVar112._8_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar85 >> 3 & 1);
                        auVar137._12_4_ =
                             (uint)bVar12 * auVar112._12_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar85 >> 4 & 1);
                        auVar137._16_4_ =
                             (uint)bVar12 * auVar112._16_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar85 >> 5 & 1);
                        auVar137._20_4_ =
                             (uint)bVar12 * auVar112._20_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar85 >> 6 & 1);
                        auVar137._24_4_ =
                             (uint)bVar12 * auVar112._24_4_ | (uint)!bVar12 * 0x7f800000;
                        auVar137._28_4_ =
                             (uint)(bVar85 >> 7) * auVar112._28_4_ |
                             (uint)!(bool)(bVar85 >> 7) * 0x7f800000;
                        auVar112 = vshufps_avx(auVar137,auVar137,0xb1);
                        auVar112 = vminps_avx(auVar137,auVar112);
                        auVar113 = vshufpd_avx(auVar112,auVar112,5);
                        auVar112 = vminps_avx(auVar112,auVar113);
                        auVar113 = vpermpd_avx2(auVar112,0x4e);
                        auVar112 = vminps_avx(auVar112,auVar113);
                        uVar150 = vcmpps_avx512vl(auVar137,auVar112,0);
                        bVar75 = (byte)uVar150 & bVar85;
                        bVar76 = bVar85;
                        if (bVar75 != 0) {
                          bVar76 = bVar75;
                        }
                        uVar217 = 0;
                        for (uVar79 = (uint)bVar76; (uVar79 & 1) == 0;
                            uVar79 = uVar79 >> 1 | 0x80000000) {
                          uVar217 = uVar217 + 1;
                        }
                        uVar77 = (ulong)uVar217;
                      }
                    } while (bVar85 != 0);
                  }
                }
              }
            }
          }
          auVar213 = ZEXT3264(auVar181);
          auVar183 = ZEXT3264(auVar123);
          lVar82 = lVar82 + 8;
        } while ((int)lVar82 < iVar7);
      }
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar24._4_4_ = uVar3;
      auVar24._0_4_ = uVar3;
      auVar24._8_4_ = uVar3;
      auVar24._12_4_ = uVar3;
      uVar150 = vcmpps_avx512vl(local_2f0,auVar24,2);
      uVar83 = (uint)uVar84 & (uint)uVar150;
      uVar84 = (ulong)uVar83;
    } while (uVar83 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }